

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  byte bVar78;
  ulong uVar79;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined8 in_R10;
  long lVar80;
  bool bVar81;
  ulong uVar82;
  uint uVar83;
  uint uVar142;
  uint uVar143;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar144;
  uint uVar148;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float pp;
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar165;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar166 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar182;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar222;
  float fVar223;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar235 [32];
  undefined1 auVar234 [16];
  undefined1 auVar236 [32];
  undefined1 auVar233 [16];
  undefined1 auVar237 [64];
  float fVar241;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar240 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar256;
  undefined1 auVar252 [32];
  float fVar254;
  float fVar255;
  undefined1 auVar253 [64];
  float fVar257;
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  float s;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b24;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 (*local_858) [32];
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  float local_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  RTCHitN local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar82 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar88 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar89 = vsubps_avx(auVar17,*(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  fVar198 = fVar1 * auVar89._0_4_;
  fVar149 = fVar1 * auVar88._0_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar82 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar17);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar82 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar18);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar82 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar100 = vpmovsxbd_avx2(auVar2);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar82 * 0xc + 6);
  auVar101 = vpmovsxbd_avx2(auVar3);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar82 * 0xd + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar82 * 0x12 + 6);
  auVar102 = vpmovsxbd_avx2(auVar91);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar82 * 0x13 + 6);
  auVar103 = vpmovsxbd_avx2(auVar86);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar82 * 0x14 + 6);
  auVar105 = vpmovsxbd_avx2(auVar87);
  auVar104 = vcvtdq2ps_avx(auVar105);
  auVar112._4_4_ = fVar149;
  auVar112._0_4_ = fVar149;
  auVar112._8_4_ = fVar149;
  auVar112._12_4_ = fVar149;
  auVar112._16_4_ = fVar149;
  auVar112._20_4_ = fVar149;
  auVar112._24_4_ = fVar149;
  auVar112._28_4_ = fVar149;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar95 = ZEXT1632(CONCAT412(fVar1 * auVar88._12_4_,
                               CONCAT48(fVar1 * auVar88._8_4_,
                                        CONCAT44(fVar1 * auVar88._4_4_,fVar149))));
  auVar94 = vpermps_avx2(auVar115,auVar95);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar93 = vpermps_avx512vl(auVar92,auVar95);
  fVar149 = auVar93._0_4_;
  auVar237._0_4_ = fVar149 * auVar97._0_4_;
  fVar199 = auVar93._4_4_;
  auVar237._4_4_ = fVar199 * auVar97._4_4_;
  fVar219 = auVar93._8_4_;
  auVar237._8_4_ = fVar219 * auVar97._8_4_;
  fVar220 = auVar93._12_4_;
  auVar237._12_4_ = fVar220 * auVar97._12_4_;
  fVar221 = auVar93._16_4_;
  auVar237._16_4_ = fVar221 * auVar97._16_4_;
  fVar222 = auVar93._20_4_;
  auVar237._20_4_ = fVar222 * auVar97._20_4_;
  fVar223 = auVar93._24_4_;
  auVar237._28_36_ = in_ZMM4._28_36_;
  auVar237._24_4_ = fVar223 * auVar97._24_4_;
  auVar95._4_4_ = auVar99._4_4_ * fVar199;
  auVar95._0_4_ = auVar99._0_4_ * fVar149;
  auVar95._8_4_ = auVar99._8_4_ * fVar219;
  auVar95._12_4_ = auVar99._12_4_ * fVar220;
  auVar95._16_4_ = auVar99._16_4_ * fVar221;
  auVar95._20_4_ = auVar99._20_4_ * fVar222;
  auVar95._24_4_ = auVar99._24_4_ * fVar223;
  auVar95._28_4_ = auVar105._28_4_;
  auVar105._4_4_ = auVar104._4_4_ * fVar199;
  auVar105._0_4_ = auVar104._0_4_ * fVar149;
  auVar105._8_4_ = auVar104._8_4_ * fVar219;
  auVar105._12_4_ = auVar104._12_4_ * fVar220;
  auVar105._16_4_ = auVar104._16_4_ * fVar221;
  auVar105._20_4_ = auVar104._20_4_ * fVar222;
  auVar105._24_4_ = auVar104._24_4_ * fVar223;
  auVar105._28_4_ = auVar93._28_4_;
  auVar17 = vfmadd231ps_fma(auVar237._0_32_,auVar94,auVar96);
  auVar18 = vfmadd231ps_fma(auVar95,auVar94,auVar101);
  auVar84 = vfmadd231ps_fma(auVar105,auVar103,auVar94);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,auVar98);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar112,auVar100);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,auVar112);
  auVar114._4_4_ = fVar198;
  auVar114._0_4_ = fVar198;
  auVar114._8_4_ = fVar198;
  auVar114._12_4_ = fVar198;
  auVar114._16_4_ = fVar198;
  auVar114._20_4_ = fVar198;
  auVar114._24_4_ = fVar198;
  auVar114._28_4_ = fVar198;
  auVar94 = ZEXT1632(CONCAT412(fVar1 * auVar89._12_4_,
                               CONCAT48(fVar1 * auVar89._8_4_,
                                        CONCAT44(fVar1 * auVar89._4_4_,fVar198))));
  auVar105 = vpermps_avx2(auVar115,auVar94);
  auVar94 = vpermps_avx512vl(auVar92,auVar94);
  auVar95 = vmulps_avx512vl(auVar94,auVar97);
  auVar107._0_4_ = auVar94._0_4_ * auVar99._0_4_;
  auVar107._4_4_ = auVar94._4_4_ * auVar99._4_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar99._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar99._12_4_;
  auVar107._16_4_ = auVar94._16_4_ * auVar99._16_4_;
  auVar107._20_4_ = auVar94._20_4_ * auVar99._20_4_;
  auVar107._24_4_ = auVar94._24_4_ * auVar99._24_4_;
  auVar107._28_4_ = 0;
  auVar99._4_4_ = auVar94._4_4_ * auVar104._4_4_;
  auVar99._0_4_ = auVar94._0_4_ * auVar104._0_4_;
  auVar99._8_4_ = auVar94._8_4_ * auVar104._8_4_;
  auVar99._12_4_ = auVar94._12_4_ * auVar104._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * auVar104._16_4_;
  auVar99._20_4_ = auVar94._20_4_ * auVar104._20_4_;
  auVar99._24_4_ = auVar94._24_4_ * auVar104._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar96 = vfmadd231ps_avx512vl(auVar95,auVar105,auVar96);
  auVar2 = vfmadd231ps_fma(auVar107,auVar105,auVar101);
  auVar3 = vfmadd231ps_fma(auVar99,auVar105,auVar103);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar98);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar114,auVar100);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar114,auVar102);
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  auVar98 = vandps_avx(ZEXT1632(auVar17),auVar109);
  auVar111._8_4_ = 0x219392ef;
  auVar111._0_8_ = 0x219392ef219392ef;
  auVar111._12_4_ = 0x219392ef;
  auVar111._16_4_ = 0x219392ef;
  auVar111._20_4_ = 0x219392ef;
  auVar111._24_4_ = 0x219392ef;
  auVar111._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar98,auVar111,1);
  bVar81 = (bool)((byte)uVar77 & 1);
  auVar94._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar17._0_4_;
  bVar81 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar17._4_4_;
  bVar81 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar17._8_4_;
  bVar81 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar17._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar18),auVar109);
  uVar77 = vcmpps_avx512vl(auVar98,auVar111,1);
  bVar81 = (bool)((byte)uVar77 & 1);
  auVar92._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar18._0_4_;
  bVar81 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar18._4_4_;
  bVar81 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar18._8_4_;
  bVar81 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar18._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(ZEXT1632(auVar84),auVar109);
  uVar77 = vcmpps_avx512vl(auVar98,auVar111,1);
  bVar81 = (bool)((byte)uVar77 & 1);
  auVar98._0_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._0_4_;
  bVar81 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._4_4_;
  bVar81 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._8_4_;
  bVar81 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar81 * 0x219392ef | (uint)!bVar81 * auVar84._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar110._8_4_ = 0x3f800000;
  auVar110._0_8_ = 0x3f8000003f800000;
  auVar110._12_4_ = 0x3f800000;
  auVar110._16_4_ = 0x3f800000;
  auVar110._20_4_ = 0x3f800000;
  auVar110._24_4_ = 0x3f800000;
  auVar110._28_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar94,auVar97,auVar110);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar92);
  auVar18 = vfnmadd213ps_fma(auVar92,auVar97,auVar110);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar98);
  auVar84 = vfnmadd213ps_fma(auVar98,auVar97,auVar110);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar97,auVar97);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar96);
  auVar102._4_4_ = auVar17._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar17._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar17._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar17._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx512vl(auVar98,auVar96);
  auVar108._0_4_ = auVar17._0_4_ * auVar98._0_4_;
  auVar108._4_4_ = auVar17._4_4_ * auVar98._4_4_;
  auVar108._8_4_ = auVar17._8_4_ * auVar98._8_4_;
  auVar108._12_4_ = auVar17._12_4_ * auVar98._12_4_;
  auVar108._16_4_ = auVar98._16_4_ * 0.0;
  auVar108._20_4_ = auVar98._20_4_ * 0.0;
  auVar108._24_4_ = auVar98._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0xe + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar2));
  auVar99 = vpbroadcastd_avx512vl();
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar103._4_4_ = auVar18._4_4_ * auVar98._4_4_;
  auVar103._0_4_ = auVar18._0_4_ * auVar98._0_4_;
  auVar103._8_4_ = auVar18._8_4_ * auVar98._8_4_;
  auVar103._12_4_ = auVar18._12_4_ * auVar98._12_4_;
  auVar103._16_4_ = auVar98._16_4_ * 0.0;
  auVar103._20_4_ = auVar98._20_4_ * 0.0;
  auVar103._24_4_ = auVar98._24_4_ * 0.0;
  auVar103._28_4_ = auVar98._28_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar2));
  auVar106._0_4_ = auVar18._0_4_ * auVar98._0_4_;
  auVar106._4_4_ = auVar18._4_4_ * auVar98._4_4_;
  auVar106._8_4_ = auVar18._8_4_ * auVar98._8_4_;
  auVar106._12_4_ = auVar18._12_4_ * auVar98._12_4_;
  auVar106._16_4_ = auVar98._16_4_ * 0.0;
  auVar106._20_4_ = auVar98._20_4_ * 0.0;
  auVar106._24_4_ = auVar98._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x15 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar3));
  auVar104._4_4_ = auVar98._4_4_ * auVar84._4_4_;
  auVar104._0_4_ = auVar98._0_4_ * auVar84._0_4_;
  auVar104._8_4_ = auVar98._8_4_ * auVar84._8_4_;
  auVar104._12_4_ = auVar98._12_4_ * auVar84._12_4_;
  auVar104._16_4_ = auVar98._16_4_ * 0.0;
  auVar104._20_4_ = auVar98._20_4_ * 0.0;
  auVar104._24_4_ = auVar98._24_4_ * 0.0;
  auVar104._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar3));
  auVar93._0_4_ = auVar84._0_4_ * auVar98._0_4_;
  auVar93._4_4_ = auVar84._4_4_ * auVar98._4_4_;
  auVar93._8_4_ = auVar84._8_4_ * auVar98._8_4_;
  auVar93._12_4_ = auVar84._12_4_ * auVar98._12_4_;
  auVar93._16_4_ = auVar98._16_4_ * 0.0;
  auVar93._20_4_ = auVar98._20_4_ * 0.0;
  auVar93._24_4_ = auVar98._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar102,auVar108);
  auVar96 = vpminsd_avx2(auVar103,auVar106);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar104,auVar93);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar97._4_4_ = uVar165;
  auVar97._0_4_ = uVar165;
  auVar97._8_4_ = uVar165;
  auVar97._12_4_ = uVar165;
  auVar97._16_4_ = uVar165;
  auVar97._20_4_ = uVar165;
  auVar97._24_4_ = uVar165;
  auVar97._28_4_ = uVar165;
  auVar96 = vmaxps_avx512vl(auVar96,auVar97);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar102,auVar108);
  auVar96 = vpmaxsd_avx2(auVar103,auVar106);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar104,auVar93);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar100._4_4_ = uVar165;
  auVar100._0_4_ = uVar165;
  auVar100._8_4_ = uVar165;
  auVar100._12_4_ = uVar165;
  auVar100._16_4_ = uVar165;
  auVar100._20_4_ = uVar165;
  auVar100._24_4_ = uVar165;
  auVar100._28_4_ = uVar165;
  auVar96 = vminps_avx512vl(auVar96,auVar100);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar101);
  uVar19 = vcmpps_avx512vl(local_340,auVar98,2);
  uVar21 = vpcmpgtd_avx512vl(auVar99,_DAT_01fb4ba0);
  local_848 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar19 & (byte)uVar21));
  local_858 = (undefined1 (*) [32])&local_3e0;
  local_560 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_850 = prim;
LAB_01a429fd:
  if (local_848 == 0) {
    return;
  }
  lVar80 = 0;
  for (uVar77 = local_848; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar80 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar4].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar7[1].time_range.upper;
  auVar17 = *(undefined1 (*) [16])(lVar80 + (long)p_Var8 * uVar77);
  auVar18 = *(undefined1 (*) [16])(lVar80 + (uVar77 + 1) * (long)p_Var8);
  local_848 = local_848 - 1 & local_848;
  if (local_848 != 0) {
    uVar79 = local_848 - 1 & local_848;
    for (uVar82 = local_848; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    }
    if (uVar79 != 0) {
      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar2 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar165;
  auVar90._0_4_ = uVar165;
  auVar90._8_4_ = uVar165;
  auVar90._12_4_ = uVar165;
  local_620._16_4_ = uVar165;
  local_620._0_16_ = auVar90;
  local_620._20_4_ = uVar165;
  local_620._24_4_ = uVar165;
  local_620._28_4_ = uVar165;
  uVar165 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar264._4_4_ = uVar165;
  auVar264._0_4_ = uVar165;
  auVar264._8_4_ = uVar165;
  auVar264._12_4_ = uVar165;
  local_4e0._16_4_ = uVar165;
  local_4e0._0_16_ = auVar264;
  local_4e0._20_4_ = uVar165;
  local_4e0._24_4_ = uVar165;
  local_4e0._28_4_ = uVar165;
  auVar84 = vunpcklps_avx(auVar90,auVar264);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar266 = ZEXT3264(auVar98);
  auVar91 = auVar98._0_16_;
  local_7f0 = vinsertps_avx512f(auVar84,auVar91,0x28);
  auVar89._0_4_ = auVar17._0_4_ + auVar18._0_4_;
  auVar89._4_4_ = auVar17._4_4_ + auVar18._4_4_;
  auVar89._8_4_ = auVar17._8_4_ + auVar18._8_4_;
  auVar89._12_4_ = auVar17._12_4_ + auVar18._12_4_;
  auVar88._8_4_ = 0x3f000000;
  auVar88._0_8_ = 0x3f0000003f000000;
  auVar88._12_4_ = 0x3f000000;
  auVar84 = vmulps_avx512vl(auVar89,auVar88);
  auVar84 = vsubps_avx(auVar84,auVar2);
  auVar84 = vdpps_avx(auVar84,local_7f0,0x7f);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar258 = ZEXT1664(local_800);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar259 = ZEXT464((uint)fVar1);
  auVar238._4_12_ = ZEXT812(0) << 0x20;
  auVar238._0_4_ = local_800._0_4_;
  auVar85 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar238);
  auVar3 = vfnmadd213ss_fma(auVar85,local_800,ZEXT416(0x40000000));
  local_320 = auVar84._0_4_ * auVar85._0_4_ * auVar3._0_4_;
  auVar239._4_4_ = local_320;
  auVar239._0_4_ = local_320;
  auVar239._8_4_ = local_320;
  auVar239._12_4_ = local_320;
  fStack_5d0 = local_320;
  _local_5e0 = auVar239;
  fStack_5cc = local_320;
  fStack_5c8 = local_320;
  fStack_5c4 = local_320;
  auVar84 = vfmadd231ps_fma(auVar2,local_7f0,auVar239);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar17 = vsubps_avx(auVar17,auVar84);
  auVar2 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar77 + 2) * (long)p_Var8),auVar84);
  auVar248 = ZEXT1664(auVar2);
  auVar18 = vsubps_avx(auVar18,auVar84);
  auVar253 = ZEXT1664(auVar18);
  auVar84 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar77 + 3) * (long)p_Var8),auVar84);
  auVar98 = vbroadcastss_avx512vl(auVar17);
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  local_780 = ZEXT1632(auVar17);
  auVar96 = vpermps_avx512vl(auVar117,local_780);
  auVar118._8_4_ = 2;
  auVar118._0_8_ = 0x200000002;
  auVar118._12_4_ = 2;
  auVar118._16_4_ = 2;
  auVar118._20_4_ = 2;
  auVar118._24_4_ = 2;
  auVar118._28_4_ = 2;
  auVar97 = vpermps_avx512vl(auVar118,local_780);
  auVar119._8_4_ = 3;
  auVar119._0_8_ = 0x300000003;
  auVar119._12_4_ = 3;
  auVar119._16_4_ = 3;
  auVar119._20_4_ = 3;
  auVar119._24_4_ = 3;
  auVar119._28_4_ = 3;
  auVar100 = vpermps_avx512vl(auVar119,local_780);
  auVar101 = vbroadcastss_avx512vl(auVar18);
  local_7c0 = ZEXT1632(auVar18);
  auVar99 = vpermps_avx512vl(auVar117,local_7c0);
  auVar102 = vpermps_avx512vl(auVar118,local_7c0);
  auVar103 = vpermps_avx512vl(auVar119,local_7c0);
  auVar104 = vbroadcastss_avx512vl(auVar2);
  local_7a0 = ZEXT1632(auVar2);
  auVar105 = vpermps_avx512vl(auVar117,local_7a0);
  local_2a0 = vpermps_avx512vl(auVar118,local_7a0);
  local_220 = vpermps_avx2(auVar119,local_7a0);
  local_2c0 = auVar84._0_4_;
  _local_7e0 = ZEXT1632(auVar84);
  local_240 = vpermps_avx2(auVar117,_local_7e0);
  local_2e0 = vpermps_avx512vl(auVar118,_local_7e0);
  local_300 = vpermps_avx2(auVar119,_local_7e0);
  local_280._16_16_ = local_2e0._16_16_;
  local_280._0_16_ = vmulss_avx512f(auVar91,auVar91);
  auVar17 = vfmadd231ps_fma(ZEXT1632(local_280._0_16_),local_4e0,local_4e0);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_620,local_620);
  local_260._0_4_ = auVar17._0_4_;
  local_260._4_4_ = local_260._0_4_;
  local_260._8_4_ = local_260._0_4_;
  local_260._12_4_ = local_260._0_4_;
  local_260._16_4_ = local_260._0_4_;
  local_260._20_4_ = local_260._0_4_;
  local_260._24_4_ = local_260._0_4_;
  local_260._28_4_ = local_260._0_4_;
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_260,auVar116);
  local_710 = ZEXT416((uint)local_320);
  local_320 = fVar1 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_500 = vpbroadcastd_avx512vl();
  uVar77 = 0;
  local_b24 = 1;
  local_520 = vpbroadcastd_avx512vl();
  auVar17 = vsqrtss_avx(local_800,local_800);
  auVar18 = vsqrtss_avx(local_800,local_800);
  local_570 = ZEXT816(0x3f80000000000000);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar267 = ZEXT3264(auVar94);
  auVar237 = ZEXT3264(_DAT_01f7b040);
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  do {
    auVar84 = vmovshdup_avx(local_570);
    auVar84 = vsubps_avx(auVar84,local_570);
    auVar156._0_4_ = auVar84._0_4_;
    fVar149 = auVar156._0_4_ * 0.04761905;
    uVar165 = local_570._0_4_;
    auVar228._4_4_ = uVar165;
    auVar228._0_4_ = uVar165;
    auVar228._8_4_ = uVar165;
    auVar228._12_4_ = uVar165;
    auVar228._16_4_ = uVar165;
    auVar228._20_4_ = uVar165;
    auVar228._24_4_ = uVar165;
    auVar228._28_4_ = uVar165;
    auVar156._4_4_ = auVar156._0_4_;
    auVar156._8_4_ = auVar156._0_4_;
    auVar156._12_4_ = auVar156._0_4_;
    auVar156._16_4_ = auVar156._0_4_;
    auVar156._20_4_ = auVar156._0_4_;
    auVar156._24_4_ = auVar156._0_4_;
    auVar156._28_4_ = auVar156._0_4_;
    auVar84 = vfmadd231ps_fma(auVar228,auVar156,auVar237._0_32_);
    auVar94 = vsubps_avx512vl(auVar267._0_32_,ZEXT1632(auVar84));
    fVar199 = auVar84._0_4_;
    fVar219 = auVar84._4_4_;
    fVar220 = auVar84._8_4_;
    fVar221 = auVar84._12_4_;
    fVar223 = auVar94._0_4_;
    fVar198 = auVar94._4_4_;
    fVar241 = auVar94._8_4_;
    fVar242 = auVar94._12_4_;
    fVar243 = auVar94._16_4_;
    fVar182 = auVar94._20_4_;
    fVar244 = auVar94._24_4_;
    auVar113._4_4_ = fVar198 * fVar198 * -fVar219;
    auVar113._0_4_ = fVar223 * fVar223 * -fVar199;
    auVar113._8_4_ = fVar241 * fVar241 * -fVar220;
    auVar113._12_4_ = fVar242 * fVar242 * -fVar221;
    auVar113._16_4_ = fVar243 * fVar243 * -0.0;
    auVar113._20_4_ = fVar182 * fVar182 * -0.0;
    auVar113._24_4_ = fVar244 * fVar244 * -0.0;
    auVar113._28_4_ = 0x80000000;
    auVar248._0_28_ =
         ZEXT1628(CONCAT412(fVar221 * fVar221,
                            CONCAT48(fVar220 * fVar220,CONCAT44(fVar219 * fVar219,fVar199 * fVar199)
                                    )));
    fVar249 = fVar199 * 3.0;
    fVar254 = fVar219 * 3.0;
    fVar255 = fVar220 * 3.0;
    fVar256 = fVar221 * 3.0;
    auVar267._28_36_ = auVar253._28_36_;
    auVar267._0_28_ = ZEXT1628(CONCAT412(fVar256,CONCAT48(fVar255,CONCAT44(fVar254,fVar249))));
    fVar257 = auVar253._28_4_ + -5.0;
    auVar177._0_4_ = (fVar249 + -5.0) * fVar199 * fVar199 + 2.0;
    auVar177._4_4_ = (fVar254 + -5.0) * fVar219 * fVar219 + 2.0;
    auVar177._8_4_ = (fVar255 + -5.0) * fVar220 * fVar220 + 2.0;
    auVar177._12_4_ = (fVar256 + -5.0) * fVar221 * fVar221 + 2.0;
    auVar177._16_4_ = 0x40000000;
    auVar177._20_4_ = 0x40000000;
    auVar177._24_4_ = 0x40000000;
    auVar177._28_4_ = 0x40000000;
    auVar253._0_4_ = fVar223 * fVar223;
    auVar253._4_4_ = fVar198 * fVar198;
    auVar253._8_4_ = fVar241 * fVar241;
    auVar253._12_4_ = fVar242 * fVar242;
    auVar253._16_4_ = fVar243 * fVar243;
    auVar253._20_4_ = fVar182 * fVar182;
    auVar253._28_36_ = auVar258._28_36_;
    auVar253._24_4_ = fVar244 * fVar244;
    auVar195._0_4_ = auVar253._0_4_ * (fVar223 * 3.0 + -5.0) + 2.0;
    auVar195._4_4_ = auVar253._4_4_ * (fVar198 * 3.0 + -5.0) + 2.0;
    auVar195._8_4_ = auVar253._8_4_ * (fVar241 * 3.0 + -5.0) + 2.0;
    auVar195._12_4_ = auVar253._12_4_ * (fVar242 * 3.0 + -5.0) + 2.0;
    auVar195._16_4_ = auVar253._16_4_ * (fVar243 * 3.0 + -5.0) + 2.0;
    auVar195._20_4_ = auVar253._20_4_ * (fVar182 * 3.0 + -5.0) + 2.0;
    auVar195._24_4_ = auVar253._24_4_ * (fVar244 * 3.0 + -5.0) + 2.0;
    auVar195._28_4_ = auVar259._28_4_ + -5.0 + 2.0;
    fVar222 = auVar94._28_4_;
    auVar265._4_4_ = fVar219 * fVar219 * -fVar198;
    auVar265._0_4_ = fVar199 * fVar199 * -fVar223;
    auVar265._8_4_ = fVar220 * fVar220 * -fVar241;
    auVar265._12_4_ = fVar221 * fVar221 * -fVar242;
    auVar265._16_4_ = -fVar243 * 0.0 * 0.0;
    auVar265._20_4_ = -fVar182 * 0.0 * 0.0;
    auVar265._24_4_ = -fVar244 * 0.0 * 0.0;
    auVar265._28_4_ = -fVar222;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar113,auVar93);
    auVar106 = vmulps_avx512vl(auVar177,auVar93);
    auVar95 = vmulps_avx512vl(auVar195,auVar93);
    auVar92 = vmulps_avx512vl(auVar265,auVar93);
    auVar126._4_4_ = fStack_2bc * auVar92._4_4_;
    auVar126._0_4_ = local_2c0 * auVar92._0_4_;
    auVar126._8_4_ = fStack_2b8 * auVar92._8_4_;
    auVar126._12_4_ = fStack_2b4 * auVar92._12_4_;
    auVar126._16_4_ = fStack_2b0 * auVar92._16_4_;
    auVar126._20_4_ = fStack_2ac * auVar92._20_4_;
    auVar126._24_4_ = fStack_2a8 * auVar92._24_4_;
    auVar126._28_4_ = auVar195._28_4_;
    auVar107 = vmulps_avx512vl(local_240,auVar92);
    auVar108 = vmulps_avx512vl(local_2e0,auVar92);
    auVar129._4_4_ = local_300._4_4_ * auVar92._4_4_;
    auVar129._0_4_ = local_300._0_4_ * auVar92._0_4_;
    auVar129._8_4_ = local_300._8_4_ * auVar92._8_4_;
    auVar129._12_4_ = local_300._12_4_ * auVar92._12_4_;
    auVar129._16_4_ = local_300._16_4_ * auVar92._16_4_;
    auVar129._20_4_ = local_300._20_4_ * auVar92._20_4_;
    auVar129._24_4_ = local_300._24_4_ * auVar92._24_4_;
    auVar129._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar126,auVar95,auVar104);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar105);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar95,local_2a0);
    auVar95 = vfmadd231ps_avx512vl(auVar129,local_220,auVar95);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar106,auVar101);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar99);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar102);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar98);
    auVar110 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar96);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar94,auVar97);
    auVar107 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar94);
    auVar130._4_4_ = (fVar198 + fVar198) * fVar219;
    auVar130._0_4_ = (fVar223 + fVar223) * fVar199;
    auVar130._8_4_ = (fVar241 + fVar241) * fVar220;
    auVar130._12_4_ = (fVar242 + fVar242) * fVar221;
    auVar130._16_4_ = (fVar243 + fVar243) * 0.0;
    auVar130._20_4_ = (fVar182 + fVar182) * 0.0;
    auVar130._24_4_ = (fVar244 + fVar244) * 0.0;
    auVar130._28_4_ = auVar106._28_4_;
    auVar94 = vsubps_avx(auVar130,auVar253._0_32_);
    auVar229._0_28_ =
         ZEXT1628(CONCAT412((fVar221 + fVar221) * (fVar256 + -5.0) + fVar256 * fVar221,
                            CONCAT48((fVar220 + fVar220) * (fVar255 + -5.0) + fVar255 * fVar220,
                                     CONCAT44((fVar219 + fVar219) * (fVar254 + -5.0) +
                                              fVar254 * fVar219,
                                              (fVar199 + fVar199) * (fVar249 + -5.0) +
                                              fVar249 * fVar199))));
    auVar229._28_4_ = fVar257 + 0.0;
    auVar120._8_4_ = 0x40000000;
    auVar120._0_8_ = 0x4000000040000000;
    auVar120._12_4_ = 0x40000000;
    auVar120._16_4_ = 0x40000000;
    auVar120._20_4_ = 0x40000000;
    auVar120._24_4_ = 0x40000000;
    auVar120._28_4_ = 0x40000000;
    auVar95 = vaddps_avx512vl(auVar267._0_32_,auVar120);
    auVar39._4_4_ = (fVar198 + fVar198) * auVar95._4_4_;
    auVar39._0_4_ = (fVar223 + fVar223) * auVar95._0_4_;
    auVar39._8_4_ = (fVar241 + fVar241) * auVar95._8_4_;
    auVar39._12_4_ = (fVar242 + fVar242) * auVar95._12_4_;
    auVar39._16_4_ = (fVar243 + fVar243) * auVar95._16_4_;
    auVar39._20_4_ = (fVar182 + fVar182) * auVar95._20_4_;
    auVar39._24_4_ = (fVar244 + fVar244) * auVar95._24_4_;
    auVar39._28_4_ = auVar95._28_4_;
    auVar40._4_4_ = fVar198 * 3.0 * fVar198;
    auVar40._0_4_ = fVar223 * 3.0 * fVar223;
    auVar40._8_4_ = fVar241 * 3.0 * fVar241;
    auVar40._12_4_ = fVar242 * 3.0 * fVar242;
    auVar40._16_4_ = fVar243 * 3.0 * fVar243;
    auVar40._20_4_ = fVar182 * 3.0 * fVar182;
    auVar40._24_4_ = fVar244 * 3.0 * fVar244;
    auVar40._28_4_ = fVar222;
    auVar95 = vsubps_avx(auVar39,auVar40);
    auVar92 = vsubps_avx(auVar248._0_32_,auVar130);
    auVar94 = vmulps_avx512vl(auVar94,auVar93);
    auVar111 = vmulps_avx512vl(auVar229,auVar93);
    auVar95 = vmulps_avx512vl(auVar95,auVar93);
    auVar92 = vmulps_avx512vl(auVar92,auVar93);
    auVar41._4_4_ = fStack_2bc * auVar92._4_4_;
    auVar41._0_4_ = local_2c0 * auVar92._0_4_;
    auVar41._8_4_ = fStack_2b8 * auVar92._8_4_;
    auVar41._12_4_ = fStack_2b4 * auVar92._12_4_;
    auVar41._16_4_ = fStack_2b0 * auVar92._16_4_;
    auVar41._20_4_ = fStack_2ac * auVar92._20_4_;
    auVar41._24_4_ = fStack_2a8 * auVar92._24_4_;
    auVar41._28_4_ = fVar257;
    auVar93 = vmulps_avx512vl(local_240,auVar92);
    auVar112 = vmulps_avx512vl(local_2e0,auVar92);
    auVar42._4_4_ = local_300._4_4_ * auVar92._4_4_;
    auVar42._0_4_ = local_300._0_4_ * auVar92._0_4_;
    auVar42._8_4_ = local_300._8_4_ * auVar92._8_4_;
    auVar42._12_4_ = local_300._12_4_ * auVar92._12_4_;
    auVar42._16_4_ = local_300._16_4_ * auVar92._16_4_;
    auVar42._20_4_ = local_300._20_4_ * auVar92._20_4_;
    auVar42._24_4_ = local_300._24_4_ * auVar92._24_4_;
    auVar42._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar41,auVar95,auVar104);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar105);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar95,local_2a0);
    auVar95 = vfmadd231ps_avx512vl(auVar42,local_220,auVar95);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar111,auVar101);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar111,auVar99);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar102);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar103,auVar111);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar98);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar94,auVar97);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar94);
    auVar43._4_4_ = auVar92._4_4_ * fVar149;
    auVar43._0_4_ = auVar92._0_4_ * fVar149;
    auVar43._8_4_ = auVar92._8_4_ * fVar149;
    auVar43._12_4_ = auVar92._12_4_ * fVar149;
    auVar43._16_4_ = auVar92._16_4_ * fVar149;
    auVar43._20_4_ = auVar92._20_4_ * fVar149;
    auVar43._24_4_ = auVar92._24_4_ * fVar149;
    auVar43._28_4_ = fVar222 + fVar222;
    auVar44._4_4_ = auVar93._4_4_ * fVar149;
    auVar44._0_4_ = auVar93._0_4_ * fVar149;
    auVar44._8_4_ = auVar93._8_4_ * fVar149;
    auVar44._12_4_ = auVar93._12_4_ * fVar149;
    auVar44._16_4_ = auVar93._16_4_ * fVar149;
    auVar44._20_4_ = auVar93._20_4_ * fVar149;
    auVar44._24_4_ = auVar93._24_4_ * fVar149;
    auVar44._28_4_ = auVar106._28_4_;
    auVar45._4_4_ = auVar111._4_4_ * fVar149;
    auVar45._0_4_ = auVar111._0_4_ * fVar149;
    auVar45._8_4_ = auVar111._8_4_ * fVar149;
    auVar45._12_4_ = auVar111._12_4_ * fVar149;
    auVar45._16_4_ = auVar111._16_4_ * fVar149;
    auVar45._20_4_ = auVar111._20_4_ * fVar149;
    auVar45._24_4_ = auVar111._24_4_ * fVar149;
    auVar45._28_4_ = 0;
    fVar199 = fVar149 * auVar94._0_4_;
    fVar219 = fVar149 * auVar94._4_4_;
    auVar46._4_4_ = fVar219;
    auVar46._0_4_ = fVar199;
    fVar220 = fVar149 * auVar94._8_4_;
    auVar46._8_4_ = fVar220;
    fVar221 = fVar149 * auVar94._12_4_;
    auVar46._12_4_ = fVar221;
    fVar222 = fVar149 * auVar94._16_4_;
    auVar46._16_4_ = fVar222;
    fVar223 = fVar149 * auVar94._20_4_;
    auVar46._20_4_ = fVar223;
    fVar198 = fVar149 * auVar94._24_4_;
    auVar46._24_4_ = fVar198;
    auVar46._28_4_ = fVar149;
    auVar84 = vxorps_avx512vl(local_2a0._0_16_,local_2a0._0_16_);
    auVar111 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar84));
    local_600 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar92 = ZEXT1632(auVar84);
    auVar113 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar92);
    auVar230._0_4_ = auVar107._0_4_ + fVar199;
    auVar230._4_4_ = auVar107._4_4_ + fVar219;
    auVar230._8_4_ = auVar107._8_4_ + fVar220;
    auVar230._12_4_ = auVar107._12_4_ + fVar221;
    auVar230._16_4_ = auVar107._16_4_ + fVar222;
    auVar230._20_4_ = auVar107._20_4_ + fVar223;
    auVar230._24_4_ = auVar107._24_4_ + fVar198;
    auVar230._28_4_ = auVar107._28_4_ + fVar149;
    auVar94 = vmaxps_avx(auVar107,auVar230);
    auVar95 = vminps_avx(auVar107,auVar230);
    auVar112 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar92);
    auVar114 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar92);
    auVar115 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar92);
    auVar126 = ZEXT1632(auVar84);
    auVar116 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9fc0,auVar126);
    auVar92 = vpermt2ps_avx512vl(auVar46,_DAT_01fb9fc0,auVar126);
    auVar117 = vsubps_avx512vl(auVar112,auVar92);
    auVar92 = vsubps_avx(auVar111,auVar109);
    auVar253 = ZEXT3264(auVar92);
    auVar93 = vsubps_avx(local_600,auVar110);
    auVar248 = ZEXT3264(auVar93);
    auVar106 = vsubps_avx(auVar113,auVar108);
    auVar107 = vmulps_avx512vl(auVar93,auVar45);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar44,auVar106);
    auVar118 = vmulps_avx512vl(auVar106,auVar43);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar45,auVar92);
    auVar119 = vmulps_avx512vl(auVar92,auVar44);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar43,auVar93);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar107,auVar107);
    auVar107 = vmulps_avx512vl(auVar106,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar93,auVar93);
    auVar119 = vfmadd231ps_avx512vl(auVar107,auVar92,auVar92);
    auVar120 = vrcp14ps_avx512vl(auVar119);
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar121 = vfnmadd213ps_avx512vl(auVar120,auVar119,auVar107);
    auVar120 = vfmadd132ps_avx512vl(auVar121,auVar120,auVar120);
    auVar118 = vmulps_avx512vl(auVar118,auVar120);
    auVar121 = vmulps_avx512vl(auVar93,auVar116);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar115,auVar106);
    auVar122 = vmulps_avx512vl(auVar106,auVar114);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar116,auVar92);
    auVar123 = vmulps_avx512vl(auVar92,auVar115);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar114,auVar93);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vmulps_avx512vl(auVar121,auVar120);
    auVar118 = vmaxps_avx512vl(auVar118,auVar120);
    auVar118 = vsqrtps_avx512vl(auVar118);
    auVar120 = vmaxps_avx512vl(auVar117,auVar112);
    auVar94 = vmaxps_avx512vl(auVar94,auVar120);
    auVar120 = vaddps_avx512vl(auVar118,auVar94);
    auVar94 = vminps_avx512vl(auVar117,auVar112);
    auVar94 = vminps_avx(auVar95,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar118);
    auVar121._8_4_ = 0x3f800002;
    auVar121._0_8_ = 0x3f8000023f800002;
    auVar121._12_4_ = 0x3f800002;
    auVar121._16_4_ = 0x3f800002;
    auVar121._20_4_ = 0x3f800002;
    auVar121._24_4_ = 0x3f800002;
    auVar121._28_4_ = 0x3f800002;
    auVar95 = vmulps_avx512vl(auVar120,auVar121);
    auVar122._8_4_ = 0x3f7ffffc;
    auVar122._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar122._12_4_ = 0x3f7ffffc;
    auVar122._16_4_ = 0x3f7ffffc;
    auVar122._20_4_ = 0x3f7ffffc;
    auVar122._24_4_ = 0x3f7ffffc;
    auVar122._28_4_ = 0x3f7ffffc;
    local_760 = vmulps_avx512vl(auVar94,auVar122);
    auVar94 = vmulps_avx512vl(auVar95,auVar95);
    auVar95 = vrsqrt14ps_avx512vl(auVar119);
    auVar123._8_4_ = 0xbf000000;
    auVar123._0_8_ = 0xbf000000bf000000;
    auVar123._12_4_ = 0xbf000000;
    auVar123._16_4_ = 0xbf000000;
    auVar123._20_4_ = 0xbf000000;
    auVar123._24_4_ = 0xbf000000;
    auVar123._28_4_ = 0xbf000000;
    auVar112 = vmulps_avx512vl(auVar119,auVar123);
    fVar149 = auVar95._0_4_;
    fVar199 = auVar95._4_4_;
    fVar219 = auVar95._8_4_;
    fVar220 = auVar95._12_4_;
    fVar221 = auVar95._16_4_;
    fVar222 = auVar95._20_4_;
    fVar223 = auVar95._24_4_;
    auVar47._4_4_ = fVar199 * fVar199 * fVar199 * auVar112._4_4_;
    auVar47._0_4_ = fVar149 * fVar149 * fVar149 * auVar112._0_4_;
    auVar47._8_4_ = fVar219 * fVar219 * fVar219 * auVar112._8_4_;
    auVar47._12_4_ = fVar220 * fVar220 * fVar220 * auVar112._12_4_;
    auVar47._16_4_ = fVar221 * fVar221 * fVar221 * auVar112._16_4_;
    auVar47._20_4_ = fVar222 * fVar222 * fVar222 * auVar112._20_4_;
    auVar47._24_4_ = fVar223 * fVar223 * fVar223 * auVar112._24_4_;
    auVar47._28_4_ = auVar120._28_4_;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar47,auVar95,auVar124);
    auVar112 = vmulps_avx512vl(auVar92,auVar95);
    auVar117 = vmulps_avx512vl(auVar93,auVar95);
    auVar118 = vmulps_avx512vl(auVar106,auVar95);
    auVar119 = vsubps_avx512vl(auVar126,auVar109);
    auVar120 = vsubps_avx512vl(auVar126,auVar110);
    auVar121 = vsubps_avx512vl(auVar126,auVar108);
    auVar265 = auVar266._0_32_;
    auVar122 = vmulps_avx512vl(auVar265,auVar121);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_4e0,auVar120);
    auVar122 = vfmadd231ps_avx512vl(auVar122,local_620,auVar119);
    auVar123 = vmulps_avx512vl(auVar121,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar119);
    auVar124 = vmulps_avx512vl(auVar265,auVar118);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar117,local_4e0);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar112,local_620);
    auVar118 = vmulps_avx512vl(auVar121,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar120,auVar117);
    auVar112 = vfmadd231ps_avx512vl(auVar117,auVar119,auVar112);
    auVar117 = vmulps_avx512vl(auVar124,auVar124);
    auVar118 = vsubps_avx512vl(local_260,auVar117);
    auVar125 = vmulps_avx512vl(auVar124,auVar112);
    auVar122 = vsubps_avx512vl(auVar122,auVar125);
    auVar122 = vaddps_avx512vl(auVar122,auVar122);
    auVar125 = vmulps_avx512vl(auVar112,auVar112);
    local_880 = vsubps_avx512vl(auVar123,auVar125);
    auVar94 = vsubps_avx512vl(local_880,auVar94);
    local_640 = vmulps_avx512vl(auVar122,auVar122);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar118,auVar125);
    auVar123 = vmulps_avx512vl(_local_8a0,auVar94);
    auVar123 = vsubps_avx512vl(local_640,auVar123);
    uVar82 = vcmpps_avx512vl(auVar123,auVar126,5);
    bVar72 = (byte)uVar82;
    if (bVar72 == 0) {
LAB_01a4373b:
      auVar237 = ZEXT3264(_DAT_01f7b040);
      auVar267 = ZEXT3264(auVar107);
      auVar259 = ZEXT3264(auVar113);
      auVar258 = ZEXT3264(local_600);
    }
    else {
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar125 = vaddps_avx512vl(auVar118,auVar118);
      local_6a0 = vrcp14ps_avx512vl(auVar125);
      auVar107 = vfnmadd213ps_avx512vl(local_6a0,auVar125,auVar107);
      auVar107 = vfmadd132ps_avx512vl(auVar107,local_6a0,local_6a0);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      local_820 = vxorps_avx512vl(auVar122,auVar31);
      auVar126 = vsubps_avx512vl(local_820,auVar123);
      local_680 = vmulps_avx512vl(auVar126,auVar107);
      auVar123 = vsubps_avx512vl(auVar123,auVar122);
      local_660 = vmulps_avx512vl(auVar123,auVar107);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar107,local_680);
      auVar127._0_4_ =
           (uint)(bVar72 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar107._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar81 * auVar123._4_4_ | (uint)!bVar81 * auVar107._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar81 * auVar123._8_4_ | (uint)!bVar81 * auVar107._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar81 * auVar123._12_4_ | (uint)!bVar81 * auVar107._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar81 * auVar123._16_4_ | (uint)!bVar81 * auVar107._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar81 * auVar123._20_4_ | (uint)!bVar81 * auVar107._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar81 * auVar123._24_4_ | (uint)!bVar81 * auVar107._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar127._28_4_ = (uint)bVar81 * auVar123._28_4_ | (uint)!bVar81 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar107,local_660);
      auVar128._0_4_ =
           (uint)(bVar72 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar107._0_4_;
      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar81 * auVar123._4_4_ | (uint)!bVar81 * auVar107._4_4_;
      bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar81 * auVar123._8_4_ | (uint)!bVar81 * auVar107._8_4_;
      bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar81 * auVar123._12_4_ | (uint)!bVar81 * auVar107._12_4_;
      bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar81 * auVar123._16_4_ | (uint)!bVar81 * auVar107._16_4_;
      bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar81 * auVar123._20_4_ | (uint)!bVar81 * auVar107._20_4_;
      bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar81 * auVar123._24_4_ | (uint)!bVar81 * auVar107._24_4_;
      bVar81 = SUB81(uVar82 >> 7,0);
      auVar128._28_4_ = (uint)bVar81 * auVar123._28_4_ | (uint)!bVar81 * auVar107._28_4_;
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar107);
      local_840 = vmaxps_avx512vl(local_280,auVar107);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_6c0 = vmulps_avx512vl(local_840,auVar32);
      vandps_avx512vl(auVar118,auVar107);
      uVar79 = vcmpps_avx512vl(local_6c0,local_6c0,1);
      uVar82 = uVar82 & uVar79;
      bVar78 = (byte)uVar82;
      if (bVar78 != 0) {
        uVar79 = vcmpps_avx512vl(auVar94,_DAT_01f7b000,2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar117 = vblendmps_avx512vl(auVar94,auVar107);
        bVar76 = (byte)uVar79;
        uVar83 = (uint)(bVar76 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar76 & 1) * local_6c0._0_4_;
        bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
        uVar142 = (uint)bVar81 * auVar117._4_4_ | (uint)!bVar81 * local_6c0._4_4_;
        bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
        uVar143 = (uint)bVar81 * auVar117._8_4_ | (uint)!bVar81 * local_6c0._8_4_;
        bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
        uVar144 = (uint)bVar81 * auVar117._12_4_ | (uint)!bVar81 * local_6c0._12_4_;
        bVar81 = (bool)((byte)(uVar79 >> 4) & 1);
        uVar145 = (uint)bVar81 * auVar117._16_4_ | (uint)!bVar81 * local_6c0._16_4_;
        bVar81 = (bool)((byte)(uVar79 >> 5) & 1);
        uVar146 = (uint)bVar81 * auVar117._20_4_ | (uint)!bVar81 * local_6c0._20_4_;
        bVar81 = (bool)((byte)(uVar79 >> 6) & 1);
        uVar147 = (uint)bVar81 * auVar117._24_4_ | (uint)!bVar81 * local_6c0._24_4_;
        bVar81 = SUB81(uVar79 >> 7,0);
        uVar148 = (uint)bVar81 * auVar117._28_4_ | (uint)!bVar81 * local_6c0._28_4_;
        auVar127._0_4_ = (bVar78 & 1) * uVar83 | !(bool)(bVar78 & 1) * auVar127._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar127._4_4_ = bVar81 * uVar142 | !bVar81 * auVar127._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar127._8_4_ = bVar81 * uVar143 | !bVar81 * auVar127._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar127._12_4_ = bVar81 * uVar144 | !bVar81 * auVar127._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar127._16_4_ = bVar81 * uVar145 | !bVar81 * auVar127._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar127._20_4_ = bVar81 * uVar146 | !bVar81 * auVar127._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar127._24_4_ = bVar81 * uVar147 | !bVar81 * auVar127._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar127._28_4_ = bVar81 * uVar148 | !bVar81 * auVar127._28_4_;
        auVar94 = vblendmps_avx512vl(auVar107,auVar94);
        bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar79 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar79 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
        bVar16 = SUB81(uVar79 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar78 & 1) *
             ((uint)(bVar76 & 1) * auVar94._0_4_ | !(bool)(bVar76 & 1) * uVar83) |
             !(bool)(bVar78 & 1) * auVar128._0_4_;
        bVar10 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar10 * ((uint)bVar81 * auVar94._4_4_ | !bVar81 * uVar142) |
             !bVar10 * auVar128._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar81 * ((uint)bVar11 * auVar94._8_4_ | !bVar11 * uVar143) |
             !bVar81 * auVar128._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar81 * ((uint)bVar12 * auVar94._12_4_ | !bVar12 * uVar144) |
             !bVar81 * auVar128._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar81 * ((uint)bVar13 * auVar94._16_4_ | !bVar13 * uVar145) |
             !bVar81 * auVar128._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar81 * ((uint)bVar14 * auVar94._20_4_ | !bVar14 * uVar146) |
             !bVar81 * auVar128._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar81 * ((uint)bVar15 * auVar94._24_4_ | !bVar15 * uVar147) |
             !bVar81 * auVar128._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar81 * ((uint)bVar16 * auVar94._28_4_ | !bVar16 * uVar148) |
             !bVar81 * auVar128._28_4_;
        bVar72 = (~bVar78 | bVar76) & bVar72;
      }
      if ((bVar72 & 0x7f) == 0) {
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        goto LAB_01a4373b;
      }
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar116 = vxorps_avx512vl(auVar116,auVar94);
      auVar114 = vxorps_avx512vl(auVar114,auVar94);
      auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar115 = vxorps_avx512vl(auVar115,auVar94);
      auVar84 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_710._0_4_));
      auVar107 = vbroadcastss_avx512vl(auVar84);
      auVar117 = vminps_avx512vl(auVar107,auVar128);
      auVar71._4_4_ = fStack_31c;
      auVar71._0_4_ = local_320;
      auVar71._8_4_ = fStack_318;
      auVar71._12_4_ = fStack_314;
      auVar71._16_4_ = fStack_310;
      auVar71._20_4_ = fStack_30c;
      auVar71._24_4_ = fStack_308;
      auVar71._28_4_ = fStack_304;
      auVar118 = vmaxps_avx512vl(auVar71,auVar127);
      auVar107 = vmulps_avx512vl(auVar121,auVar45);
      auVar107 = vfmadd213ps_avx512vl(auVar120,auVar44,auVar107);
      auVar84 = vfmadd213ps_fma(auVar119,auVar43,auVar107);
      auVar107 = vmulps_avx512vl(auVar265,auVar45);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_4e0,auVar44);
      auVar119 = vfmadd231ps_avx512vl(auVar107,local_620,auVar43);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar120);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar120,auVar121,1);
      auVar123 = vxorps_avx512vl(ZEXT1632(auVar84),auVar94);
      auVar126 = vrcp14ps_avx512vl(auVar119);
      auVar129 = vxorps_avx512vl(auVar119,auVar94);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar130 = vfnmadd213ps_avx512vl(auVar126,auVar119,auVar107);
      auVar84 = vfmadd132ps_fma(auVar130,auVar126,auVar126);
      fVar149 = auVar84._0_4_ * auVar123._0_4_;
      fVar199 = auVar84._4_4_ * auVar123._4_4_;
      auVar48._4_4_ = fVar199;
      auVar48._0_4_ = fVar149;
      fVar219 = auVar84._8_4_ * auVar123._8_4_;
      auVar48._8_4_ = fVar219;
      fVar220 = auVar84._12_4_ * auVar123._12_4_;
      auVar48._12_4_ = fVar220;
      fVar221 = auVar123._16_4_ * 0.0;
      auVar48._16_4_ = fVar221;
      fVar222 = auVar123._20_4_ * 0.0;
      auVar48._20_4_ = fVar222;
      fVar223 = auVar123._24_4_ * 0.0;
      auVar48._24_4_ = fVar223;
      auVar48._28_4_ = auVar123._28_4_;
      uVar21 = vcmpps_avx512vl(auVar119,auVar129,1);
      bVar78 = (byte)uVar19 | (byte)uVar21;
      auVar262._8_4_ = 0xff800000;
      auVar262._0_8_ = 0xff800000ff800000;
      auVar262._12_4_ = 0xff800000;
      auVar262._16_4_ = 0xff800000;
      auVar262._20_4_ = 0xff800000;
      auVar262._24_4_ = 0xff800000;
      auVar262._28_4_ = 0xff800000;
      auVar126 = vblendmps_avx512vl(auVar48,auVar262);
      auVar131._0_4_ = (uint)(bVar78 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar78 & 1) * -0x800000;
      bVar81 = (bool)(bVar78 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar81 * auVar126._4_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)(bVar78 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar81 * auVar126._8_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)(bVar78 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar81 * auVar126._12_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)(bVar78 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar81 * auVar126._16_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)(bVar78 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar81 * auVar126._20_4_ | (uint)!bVar81 * -0x800000;
      bVar81 = (bool)(bVar78 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar81 * auVar126._24_4_ | (uint)!bVar81 * -0x800000;
      auVar131._28_4_ =
           (uint)(bVar78 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar78 >> 7) * -0x800000;
      auVar126 = vmaxps_avx512vl(auVar118,auVar131);
      uVar21 = vcmpps_avx512vl(auVar119,auVar129,6);
      bVar78 = (byte)uVar19 | (byte)uVar21;
      auVar132._0_4_ = (uint)(bVar78 & 1) * 0x7f800000 | (uint)!(bool)(bVar78 & 1) * (int)fVar149;
      bVar81 = (bool)(bVar78 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar199;
      bVar81 = (bool)(bVar78 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar219;
      bVar81 = (bool)(bVar78 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar220;
      bVar81 = (bool)(bVar78 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar221;
      bVar81 = (bool)(bVar78 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar222;
      bVar81 = (bool)(bVar78 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar223;
      auVar132._28_4_ =
           (uint)(bVar78 >> 7) * 0x7f800000 | (uint)!(bool)(bVar78 >> 7) * auVar123._28_4_;
      auVar117 = vminps_avx512vl(auVar117,auVar132);
      auVar84 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar84),auVar111);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar84),local_600);
      auVar123 = ZEXT1632(auVar84);
      auVar119 = vsubps_avx512vl(auVar123,auVar113);
      auVar119 = vmulps_avx512vl(auVar119,auVar116);
      auVar118 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar118);
      auVar111 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar111);
      auVar116 = vmulps_avx512vl(auVar265,auVar116);
      auVar115 = vfmadd231ps_avx512vl(auVar116,local_4e0,auVar115);
      auVar114 = vfmadd231ps_avx512vl(auVar115,local_620,auVar114);
      vandps_avx512vl(auVar114,auVar120);
      uVar19 = vcmpps_avx512vl(auVar114,auVar121,1);
      auVar111 = vxorps_avx512vl(auVar111,auVar94);
      auVar115 = vrcp14ps_avx512vl(auVar114);
      auVar113 = vxorps_avx512vl(auVar114,auVar94);
      auVar94 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar107);
      auVar84 = vfmadd132ps_fma(auVar94,auVar115,auVar115);
      fVar149 = auVar84._0_4_ * auVar111._0_4_;
      fVar199 = auVar84._4_4_ * auVar111._4_4_;
      auVar49._4_4_ = fVar199;
      auVar49._0_4_ = fVar149;
      fVar219 = auVar84._8_4_ * auVar111._8_4_;
      auVar49._8_4_ = fVar219;
      fVar220 = auVar84._12_4_ * auVar111._12_4_;
      auVar49._12_4_ = fVar220;
      fVar221 = auVar111._16_4_ * 0.0;
      auVar49._16_4_ = fVar221;
      fVar222 = auVar111._20_4_ * 0.0;
      auVar49._20_4_ = fVar222;
      fVar223 = auVar111._24_4_ * 0.0;
      auVar49._24_4_ = fVar223;
      auVar49._28_4_ = auVar111._28_4_;
      uVar21 = vcmpps_avx512vl(auVar114,auVar113,1);
      bVar78 = (byte)uVar19 | (byte)uVar21;
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      auVar33._16_4_ = 0xff800000;
      auVar33._20_4_ = 0xff800000;
      auVar33._24_4_ = 0xff800000;
      auVar33._28_4_ = 0xff800000;
      auVar94 = vblendmps_avx512vl(auVar49,auVar33);
      auVar133._0_4_ =
           (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar115._0_4_;
      bVar81 = (bool)(bVar78 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * auVar115._4_4_;
      bVar81 = (bool)(bVar78 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * auVar115._8_4_;
      bVar81 = (bool)(bVar78 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * auVar115._12_4_;
      bVar81 = (bool)(bVar78 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * auVar115._16_4_;
      bVar81 = (bool)(bVar78 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * auVar115._20_4_;
      bVar81 = (bool)(bVar78 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar81 * auVar94._24_4_ | (uint)!bVar81 * auVar115._24_4_;
      auVar133._28_4_ =
           (uint)(bVar78 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar115._28_4_;
      local_600 = vmaxps_avx(auVar126,auVar133);
      uVar21 = vcmpps_avx512vl(auVar114,auVar113,6);
      bVar78 = (byte)uVar19 | (byte)uVar21;
      auVar134._0_4_ = (uint)(bVar78 & 1) * 0x7f800000 | (uint)!(bool)(bVar78 & 1) * (int)fVar149;
      bVar81 = (bool)(bVar78 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar199;
      bVar81 = (bool)(bVar78 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar219;
      bVar81 = (bool)(bVar78 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar220;
      bVar81 = (bool)(bVar78 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar221;
      bVar81 = (bool)(bVar78 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar222;
      bVar81 = (bool)(bVar78 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)fVar223;
      auVar134._28_4_ =
           (uint)(bVar78 >> 7) * 0x7f800000 | (uint)!(bool)(bVar78 >> 7) * auVar111._28_4_;
      local_380 = vminps_avx(auVar117,auVar134);
      uVar19 = vcmpps_avx512vl(local_600,local_380,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar19;
      if (bVar72 == 0) {
        auVar266 = ZEXT3264(auVar265);
        goto LAB_01a4373b;
      }
      auVar111 = vmaxps_avx512vl(auVar123,local_760);
      auVar94 = vfmadd213ps_avx512vl(local_680,auVar124,auVar112);
      fVar149 = auVar95._0_4_;
      fVar199 = auVar95._4_4_;
      auVar50._4_4_ = fVar199 * auVar94._4_4_;
      auVar50._0_4_ = fVar149 * auVar94._0_4_;
      fVar219 = auVar95._8_4_;
      auVar50._8_4_ = fVar219 * auVar94._8_4_;
      fVar220 = auVar95._12_4_;
      auVar50._12_4_ = fVar220 * auVar94._12_4_;
      fVar221 = auVar95._16_4_;
      auVar50._16_4_ = fVar221 * auVar94._16_4_;
      fVar222 = auVar95._20_4_;
      auVar50._20_4_ = fVar222 * auVar94._20_4_;
      fVar223 = auVar95._24_4_;
      auVar50._24_4_ = fVar223 * auVar94._24_4_;
      auVar50._28_4_ = auVar94._28_4_;
      auVar94 = vfmadd213ps_avx512vl(local_660,auVar124,auVar112);
      auVar51._4_4_ = fVar199 * auVar94._4_4_;
      auVar51._0_4_ = fVar149 * auVar94._0_4_;
      auVar51._8_4_ = fVar219 * auVar94._8_4_;
      auVar51._12_4_ = fVar220 * auVar94._12_4_;
      auVar51._16_4_ = fVar221 * auVar94._16_4_;
      auVar51._20_4_ = fVar222 * auVar94._20_4_;
      auVar51._24_4_ = fVar223 * auVar94._24_4_;
      auVar51._28_4_ = auVar94._28_4_;
      auVar94 = vminps_avx512vl(auVar50,auVar107);
      auVar57 = ZEXT812(0);
      auVar114 = ZEXT1232(auVar57) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar57) << 0x20);
      auVar115 = vminps_avx512vl(auVar51,auVar107);
      auVar52._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar94._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar52,auVar156,auVar228);
      auVar94 = vmaxps_avx(auVar115,ZEXT1232(auVar57) << 0x20);
      auVar53._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar53._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar53._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar53._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar53._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar53._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar53._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar53._28_4_ = auVar94._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar53,auVar156,auVar228);
      auVar54._4_4_ = auVar111._4_4_ * auVar111._4_4_;
      auVar54._0_4_ = auVar111._0_4_ * auVar111._0_4_;
      auVar54._8_4_ = auVar111._8_4_ * auVar111._8_4_;
      auVar54._12_4_ = auVar111._12_4_ * auVar111._12_4_;
      auVar54._16_4_ = auVar111._16_4_ * auVar111._16_4_;
      auVar54._20_4_ = auVar111._20_4_ * auVar111._20_4_;
      auVar54._24_4_ = auVar111._24_4_ * auVar111._24_4_;
      auVar54._28_4_ = auVar111._28_4_;
      auVar94 = vsubps_avx(local_880,auVar54);
      auVar55._4_4_ = auVar94._4_4_ * (float)local_8a0._4_4_;
      auVar55._0_4_ = auVar94._0_4_ * (float)local_8a0._0_4_;
      auVar55._8_4_ = auVar94._8_4_ * fStack_898;
      auVar55._12_4_ = auVar94._12_4_ * fStack_894;
      auVar55._16_4_ = auVar94._16_4_ * fStack_890;
      auVar55._20_4_ = auVar94._20_4_ * fStack_88c;
      auVar55._24_4_ = auVar94._24_4_ * fStack_888;
      auVar55._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(local_640,auVar55);
      uVar19 = vcmpps_avx512vl(auVar111,ZEXT1232(auVar57) << 0x20,5);
      bVar78 = (byte)uVar19;
      if (bVar78 == 0) {
        bVar78 = 0;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar258 = ZEXT864(0) << 0x20;
        auVar135._8_4_ = 0x7f800000;
        auVar135._0_8_ = 0x7f8000007f800000;
        auVar135._12_4_ = 0x7f800000;
        auVar135._16_4_ = 0x7f800000;
        auVar135._20_4_ = 0x7f800000;
        auVar135._24_4_ = 0x7f800000;
        auVar135._28_4_ = 0x7f800000;
        auVar136._8_4_ = 0xff800000;
        auVar136._0_8_ = 0xff800000ff800000;
        auVar136._12_4_ = 0xff800000;
        auVar136._16_4_ = 0xff800000;
        auVar136._20_4_ = 0xff800000;
        auVar136._24_4_ = 0xff800000;
        auVar136._28_4_ = 0xff800000;
      }
      else {
        uVar82 = vcmpps_avx512vl(auVar111,auVar123,5);
        auVar111 = vsqrtps_avx(auVar111);
        auVar107 = vfnmadd213ps_avx512vl(auVar125,local_6a0,auVar107);
        auVar114 = vfmadd132ps_avx512vl(auVar107,local_6a0,local_6a0);
        auVar107 = vsubps_avx(local_820,auVar111);
        auVar116 = vmulps_avx512vl(auVar107,auVar114);
        auVar107 = vsubps_avx512vl(auVar111,auVar122);
        auVar117 = vmulps_avx512vl(auVar107,auVar114);
        auVar107 = vfmadd213ps_avx512vl(auVar124,auVar116,auVar112);
        auVar56._4_4_ = fVar199 * auVar107._4_4_;
        auVar56._0_4_ = fVar149 * auVar107._0_4_;
        auVar56._8_4_ = fVar219 * auVar107._8_4_;
        auVar56._12_4_ = fVar220 * auVar107._12_4_;
        auVar56._16_4_ = fVar221 * auVar107._16_4_;
        auVar56._20_4_ = fVar222 * auVar107._20_4_;
        auVar56._24_4_ = fVar223 * auVar107._24_4_;
        auVar56._28_4_ = auVar115._28_4_;
        auVar107 = vmulps_avx512vl(local_620,auVar116);
        auVar111 = vmulps_avx512vl(local_4e0,auVar116);
        auVar114 = vmulps_avx512vl(auVar265,auVar116);
        auVar115 = vfmadd213ps_avx512vl(auVar92,auVar56,auVar109);
        auVar107 = vsubps_avx512vl(auVar107,auVar115);
        auVar115 = vfmadd213ps_avx512vl(auVar93,auVar56,auVar110);
        auVar111 = vsubps_avx512vl(auVar111,auVar115);
        auVar84 = vfmadd213ps_fma(auVar56,auVar106,auVar108);
        auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar84));
        auVar258 = ZEXT3264(auVar114);
        auVar112 = vfmadd213ps_avx512vl(auVar124,auVar117,auVar112);
        auVar112 = vmulps_avx512vl(auVar95,auVar112);
        auVar95 = vmulps_avx512vl(local_620,auVar117);
        auVar115 = vmulps_avx512vl(local_4e0,auVar117);
        auVar118 = vmulps_avx512vl(auVar265,auVar117);
        auVar84 = vfmadd213ps_fma(auVar92,auVar112,auVar109);
        auVar114 = vsubps_avx(auVar95,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar93,auVar112,auVar110);
        auVar95 = vsubps_avx512vl(auVar115,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar106,auVar112,auVar108);
        auVar92 = vsubps_avx512vl(auVar118,ZEXT1632(auVar84));
        auVar157._8_4_ = 0x7f800000;
        auVar157._0_8_ = 0x7f8000007f800000;
        auVar157._12_4_ = 0x7f800000;
        auVar157._16_4_ = 0x7f800000;
        auVar157._20_4_ = 0x7f800000;
        auVar157._24_4_ = 0x7f800000;
        auVar157._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar157,auVar116);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar135._0_4_ = (uint)bVar81 * auVar93._0_4_ | (uint)!bVar81 * auVar109._0_4_;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar81 * auVar93._4_4_ | (uint)!bVar81 * auVar109._4_4_;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar81 * auVar93._8_4_ | (uint)!bVar81 * auVar109._8_4_;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar81 * auVar93._12_4_ | (uint)!bVar81 * auVar109._12_4_;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar81 * auVar93._16_4_ | (uint)!bVar81 * auVar109._16_4_;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar81 * auVar93._20_4_ | (uint)!bVar81 * auVar109._20_4_;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar81 * auVar93._24_4_ | (uint)!bVar81 * auVar109._24_4_;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar135._28_4_ = (uint)bVar81 * auVar93._28_4_ | (uint)!bVar81 * auVar109._28_4_;
        auVar158._8_4_ = 0xff800000;
        auVar158._0_8_ = 0xff800000ff800000;
        auVar158._12_4_ = 0xff800000;
        auVar158._16_4_ = 0xff800000;
        auVar158._20_4_ = 0xff800000;
        auVar158._24_4_ = 0xff800000;
        auVar158._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar158,auVar117);
        bVar81 = (bool)((byte)uVar82 & 1);
        auVar136._0_4_ = (uint)bVar81 * auVar93._0_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar81 * auVar93._4_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar81 * auVar93._8_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar81 * auVar93._12_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar81 * auVar93._16_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar81 * auVar93._20_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar81 * auVar93._24_4_ | (uint)!bVar81 * -0x800000;
        bVar81 = SUB81(uVar82 >> 7,0);
        auVar136._28_4_ = (uint)bVar81 * auVar93._28_4_ | (uint)!bVar81 * -0x800000;
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar93 = vmulps_avx512vl(local_840,auVar34);
        uVar79 = vcmpps_avx512vl(auVar93,local_6c0,0xe);
        uVar82 = uVar82 & uVar79;
        bVar76 = (byte)uVar82;
        if (bVar76 != 0) {
          uVar79 = vcmpps_avx512vl(auVar94,_DAT_01f7b000,2);
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar263._8_4_ = 0xff800000;
          auVar263._0_8_ = 0xff800000ff800000;
          auVar263._12_4_ = 0xff800000;
          auVar263._16_4_ = 0xff800000;
          auVar263._20_4_ = 0xff800000;
          auVar263._24_4_ = 0xff800000;
          auVar263._28_4_ = 0xff800000;
          auVar94 = vblendmps_avx512vl(auVar252,auVar263);
          bVar73 = (byte)uVar79;
          uVar83 = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar93._0_4_;
          bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
          uVar142 = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * auVar93._4_4_;
          bVar81 = (bool)((byte)(uVar79 >> 2) & 1);
          uVar143 = (uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * auVar93._8_4_;
          bVar81 = (bool)((byte)(uVar79 >> 3) & 1);
          uVar144 = (uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * auVar93._12_4_;
          bVar81 = (bool)((byte)(uVar79 >> 4) & 1);
          uVar145 = (uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * auVar93._16_4_;
          bVar81 = (bool)((byte)(uVar79 >> 5) & 1);
          uVar146 = (uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * auVar93._20_4_;
          bVar81 = (bool)((byte)(uVar79 >> 6) & 1);
          uVar147 = (uint)bVar81 * auVar94._24_4_ | (uint)!bVar81 * auVar93._24_4_;
          bVar81 = SUB81(uVar79 >> 7,0);
          uVar148 = (uint)bVar81 * auVar94._28_4_ | (uint)!bVar81 * auVar93._28_4_;
          auVar135._0_4_ = (bVar76 & 1) * uVar83 | !(bool)(bVar76 & 1) * auVar135._0_4_;
          bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar135._4_4_ = bVar81 * uVar142 | !bVar81 * auVar135._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar135._8_4_ = bVar81 * uVar143 | !bVar81 * auVar135._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar135._12_4_ = bVar81 * uVar144 | !bVar81 * auVar135._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar135._16_4_ = bVar81 * uVar145 | !bVar81 * auVar135._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar135._20_4_ = bVar81 * uVar146 | !bVar81 * auVar135._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar135._24_4_ = bVar81 * uVar147 | !bVar81 * auVar135._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar135._28_4_ = bVar81 * uVar148 | !bVar81 * auVar135._28_4_;
          auVar94 = vblendmps_avx512vl(auVar263,auVar252);
          bVar81 = (bool)((byte)(uVar79 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar79 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar79 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar79 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar79 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar79 >> 6) & 1);
          bVar16 = SUB81(uVar79 >> 7,0);
          auVar136._0_4_ =
               (uint)(bVar76 & 1) *
               ((uint)(bVar73 & 1) * auVar94._0_4_ | !(bool)(bVar73 & 1) * uVar83) |
               !(bool)(bVar76 & 1) * auVar136._0_4_;
          bVar10 = (bool)((byte)(uVar82 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar10 * ((uint)bVar81 * auVar94._4_4_ | !bVar81 * uVar142) |
               !bVar10 * auVar136._4_4_;
          bVar81 = (bool)((byte)(uVar82 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar81 * ((uint)bVar11 * auVar94._8_4_ | !bVar11 * uVar143) |
               !bVar81 * auVar136._8_4_;
          bVar81 = (bool)((byte)(uVar82 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar81 * ((uint)bVar12 * auVar94._12_4_ | !bVar12 * uVar144) |
               !bVar81 * auVar136._12_4_;
          bVar81 = (bool)((byte)(uVar82 >> 4) & 1);
          auVar136._16_4_ =
               (uint)bVar81 * ((uint)bVar13 * auVar94._16_4_ | !bVar13 * uVar145) |
               !bVar81 * auVar136._16_4_;
          bVar81 = (bool)((byte)(uVar82 >> 5) & 1);
          auVar136._20_4_ =
               (uint)bVar81 * ((uint)bVar14 * auVar94._20_4_ | !bVar14 * uVar146) |
               !bVar81 * auVar136._20_4_;
          bVar81 = (bool)((byte)(uVar82 >> 6) & 1);
          auVar136._24_4_ =
               (uint)bVar81 * ((uint)bVar15 * auVar94._24_4_ | !bVar15 * uVar147) |
               !bVar81 * auVar136._24_4_;
          bVar81 = SUB81(uVar82 >> 7,0);
          auVar136._28_4_ =
               (uint)bVar81 * ((uint)bVar16 * auVar94._28_4_ | !bVar16 * uVar148) |
               !bVar81 * auVar136._28_4_;
          bVar78 = (~bVar76 | bVar73) & bVar78;
        }
      }
      auVar266 = ZEXT3264(auVar265);
      auVar94 = vmulps_avx512vl(auVar265,auVar92);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_4e0,auVar95);
      auVar253 = ZEXT3264(local_4e0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,local_620,auVar114);
      auVar259 = ZEXT3264(local_600);
      _local_200 = local_600;
      local_1e0 = vminps_avx(local_380,auVar135);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar248 = ZEXT3264(auVar247);
      auVar94 = vandps_avx(auVar94,auVar247);
      _local_5c0 = vmaxps_avx(local_600,auVar136);
      _local_3a0 = _local_5c0;
      auVar240._8_4_ = 0x3e99999a;
      auVar240._0_8_ = 0x3e99999a3e99999a;
      auVar240._12_4_ = 0x3e99999a;
      auVar240._16_4_ = 0x3e99999a;
      auVar240._20_4_ = 0x3e99999a;
      auVar240._24_4_ = 0x3e99999a;
      auVar240._28_4_ = 0x3e99999a;
      uVar19 = vcmpps_avx512vl(auVar94,auVar240,1);
      uVar21 = vcmpps_avx512vl(local_600,local_1e0,2);
      bVar76 = (byte)uVar21 & bVar72;
      uVar20 = vcmpps_avx512vl(_local_5c0,local_380,2);
      if ((bVar72 & ((byte)uVar20 | (byte)uVar21)) == 0) {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar267 = ZEXT3264(auVar94);
        auVar237 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        bVar73 = (byte)uVar19 | ~bVar78;
        auVar94 = vmulps_avx512vl(auVar265,auVar258._0_32_);
        auVar84 = vfmadd213ps_fma(auVar111,local_4e0,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar107,local_620,ZEXT1632(auVar84));
        auVar94 = vandps_avx(auVar94,auVar247);
        uVar19 = vcmpps_avx512vl(auVar94,auVar240,1);
        bVar78 = (byte)uVar19 | ~bVar78;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar160,auVar35);
        local_360._0_4_ = (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
        bVar81 = (bool)(bVar78 >> 1 & 1);
        local_360._4_4_ = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar78 >> 2 & 1);
        local_360._8_4_ = (uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar78 >> 3 & 1);
        local_360._12_4_ = (uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar78 >> 4 & 1);
        local_360._16_4_ = (uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar78 >> 5 & 1);
        local_360._20_4_ = (uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar78 >> 6 & 1);
        local_360._24_4_ = (uint)bVar81 * auVar94._24_4_ | (uint)!bVar81 * 2;
        local_360._28_4_ = (uint)(bVar78 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar78 >> 7) * 2;
        local_540 = vpbroadcastd_avx512vl();
        uVar19 = vpcmpd_avx512vl(local_540,local_360,5);
        local_5a0 = local_600._0_4_ + (float)local_5e0._0_4_;
        fStack_59c = local_600._4_4_ + (float)local_5e0._4_4_;
        fStack_598 = local_600._8_4_ + fStack_5d8;
        fStack_594 = local_600._12_4_ + fStack_5d4;
        fStack_590 = local_600._16_4_ + fStack_5d0;
        fStack_58c = local_600._20_4_ + fStack_5cc;
        fStack_588 = local_600._24_4_ + fStack_5c8;
        fStack_584 = local_600._28_4_ + fStack_5c4;
        for (bVar78 = (byte)uVar19 & bVar76; auVar139._16_16_ = auVar105._16_16_, bVar78 != 0;
            bVar78 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar78 & (byte)uVar19) {
          auVar161._8_4_ = 0x7f800000;
          auVar161._0_8_ = 0x7f8000007f800000;
          auVar161._12_4_ = 0x7f800000;
          auVar161._16_4_ = 0x7f800000;
          auVar161._20_4_ = 0x7f800000;
          auVar161._24_4_ = 0x7f800000;
          auVar161._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar161,local_600);
          auVar138._0_4_ =
               (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 1 & 1);
          auVar138._4_4_ = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 2 & 1);
          auVar138._8_4_ = (uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 3 & 1);
          auVar138._12_4_ = (uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 4 & 1);
          auVar138._16_4_ = (uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 5 & 1);
          auVar138._20_4_ = (uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * 0x7f800000;
          auVar138._24_4_ =
               (uint)(bVar78 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
          auVar138._28_4_ = 0x7f800000;
          auVar94 = vshufps_avx(auVar138,auVar138,0xb1);
          auVar94 = vminps_avx(auVar138,auVar94);
          auVar95 = vshufpd_avx(auVar94,auVar94,5);
          auVar94 = vminps_avx(auVar94,auVar95);
          auVar95 = vpermpd_avx2(auVar94,0x4e);
          auVar94 = vminps_avx(auVar94,auVar95);
          uVar19 = vcmpps_avx512vl(auVar138,auVar94,0);
          bVar74 = (byte)uVar19 & bVar78;
          bVar75 = bVar78;
          if (bVar74 != 0) {
            bVar75 = bVar74;
          }
          iVar22 = 0;
          for (uVar83 = (uint)bVar75; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar22 = iVar22 + 1;
          }
          uVar83 = *(uint *)(local_1a0 + (uint)(iVar22 << 2));
          uVar142 = *(uint *)(local_200 + (uint)(iVar22 << 2));
          fVar149 = auVar18._0_4_;
          if ((float)local_800._0_4_ < 0.0) {
            auVar253 = ZEXT1664(auVar253._0_16_);
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar259 = ZEXT1664(auVar259._0_16_);
            fVar149 = sqrtf((float)local_800._0_4_);
          }
          auVar248 = ZEXT464(uVar142);
          auVar2 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar84 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar3 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar85 = vminps_avx(auVar2,auVar3);
          auVar2 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar3 = vmaxps_avx(auVar84,auVar2);
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar85,auVar200);
          auVar2 = vandps_avx(auVar3,auVar200);
          auVar84 = vmaxps_avx(auVar84,auVar2);
          auVar2 = vmovshdup_avx(auVar84);
          auVar2 = vmaxss_avx(auVar2,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar2);
          fVar199 = auVar84._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar3,auVar3,0xff);
          auVar84 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar83),0x10);
          auVar237 = ZEXT1664(auVar84);
          lVar80 = 5;
          do {
            do {
              bVar81 = lVar80 == 0;
              lVar80 = lVar80 + -1;
              if (bVar81) goto LAB_01a44424;
              uVar165 = auVar237._0_4_;
              auVar150._4_4_ = uVar165;
              auVar150._0_4_ = uVar165;
              auVar150._8_4_ = uVar165;
              auVar150._12_4_ = uVar165;
              auVar84 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_7f0);
              auVar2 = vmovshdup_avx(auVar237._0_16_);
              fVar241 = auVar2._0_4_;
              fVar198 = 1.0 - fVar241;
              fVar219 = fVar241 * fVar241;
              auVar87 = SUB6416(ZEXT464(0x40400000),0);
              auVar86 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar85 = vfmadd213ss_fma(auVar87,auVar2,auVar86);
              auVar3 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x40000000),0)
                                      );
              auVar91 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar198),auVar86);
              auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar198 * fVar198)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar220 = fVar198 * fVar198 * -fVar241 * 0.5;
              fVar221 = auVar3._0_4_ * 0.5;
              fVar222 = auVar91._0_4_ * 0.5;
              fVar223 = fVar241 * fVar241 * -fVar198 * 0.5;
              auVar201._0_4_ = fVar223 * (float)local_7e0._0_4_;
              auVar201._4_4_ = fVar223 * (float)local_7e0._4_4_;
              auVar201._8_4_ = fVar223 * fStack_7d8;
              auVar201._12_4_ = fVar223 * fStack_7d4;
              auVar224._4_4_ = fVar222;
              auVar224._0_4_ = fVar222;
              auVar224._8_4_ = fVar222;
              auVar224._12_4_ = fVar222;
              auVar3 = vfmadd132ps_fma(auVar224,auVar201,local_7a0._0_16_);
              auVar183._4_4_ = fVar221;
              auVar183._0_4_ = fVar221;
              auVar183._8_4_ = fVar221;
              auVar183._12_4_ = fVar221;
              auVar3 = vfmadd132ps_fma(auVar183,auVar3,local_7c0._0_16_);
              auVar202._4_4_ = fVar220;
              auVar202._0_4_ = fVar220;
              auVar202._8_4_ = fVar220;
              auVar202._12_4_ = fVar220;
              auVar3 = vfmadd132ps_fma(auVar202,auVar3,local_780._0_16_);
              auVar91 = vfmadd231ss_fma(auVar86,auVar2,ZEXT416(0x41100000));
              local_660._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar2,ZEXT416(0x40800000));
              local_680._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(auVar87,auVar2,ZEXT416(0xbf800000));
              local_6a0._0_16_ = auVar91;
              local_640._0_16_ = auVar3;
              auVar3 = vsubps_avx(auVar84,auVar3);
              auVar84 = vdpps_avx(auVar3,auVar3,0x7f);
              fVar220 = auVar84._0_4_;
              local_760 = auVar237._0_32_;
              if (fVar220 < 0.0) {
                local_880._0_4_ = auVar85._0_4_;
                _local_8a0 = ZEXT416((uint)fVar198);
                local_820._0_4_ = fVar219;
                local_840._0_4_ = fVar198 * -2.0;
                auVar258._0_4_ = sqrtf(fVar220);
                auVar258._4_60_ = extraout_var;
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar91 = auVar258._0_16_;
                auVar86 = _local_8a0;
              }
              else {
                auVar91 = vsqrtss_avx(auVar84,auVar84);
                local_840._0_4_ = fVar198 * -2.0;
                local_820._0_4_ = fVar219;
                auVar86 = ZEXT416((uint)fVar198);
              }
              fVar219 = auVar86._0_4_;
              auVar88 = vfnmadd231ss_fma(ZEXT416((uint)(fVar241 * (fVar219 + fVar219))),auVar86,
                                         auVar86);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar241 + fVar241)),
                                        ZEXT416((uint)(fVar241 * fVar241 * 3.0)));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar2,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar86);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar2,
                                        ZEXT416((uint)local_820._0_4_));
              fVar219 = auVar88._0_4_ * 0.5;
              fVar221 = auVar85._0_4_ * 0.5;
              fVar222 = auVar87._0_4_ * 0.5;
              fVar223 = auVar86._0_4_ * 0.5;
              auVar203._0_4_ = fVar223 * (float)local_7e0._0_4_;
              auVar203._4_4_ = fVar223 * (float)local_7e0._4_4_;
              auVar203._8_4_ = fVar223 * fStack_7d8;
              auVar203._12_4_ = fVar223 * fStack_7d4;
              auVar184._4_4_ = fVar222;
              auVar184._0_4_ = fVar222;
              auVar184._8_4_ = fVar222;
              auVar184._12_4_ = fVar222;
              auVar85 = vfmadd132ps_fma(auVar184,auVar203,local_7a0._0_16_);
              auVar167._4_4_ = fVar221;
              auVar167._0_4_ = fVar221;
              auVar167._8_4_ = fVar221;
              auVar167._12_4_ = fVar221;
              auVar85 = vfmadd132ps_fma(auVar167,auVar85,local_7c0._0_16_);
              auVar260._4_4_ = fVar219;
              auVar260._0_4_ = fVar219;
              auVar260._8_4_ = fVar219;
              auVar260._12_4_ = fVar219;
              local_880._0_16_ = vfmadd132ps_fma(auVar260,auVar85,local_780._0_16_);
              local_820._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar58._12_4_ = 0;
              auVar58._0_12_ = ZEXT812(0);
              fVar219 = local_820._0_4_;
              auVar85 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar219));
              fVar221 = auVar85._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar219));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_820._0_16_,auVar23);
              auVar85 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_6c0._0_4_ = auVar85._0_4_;
              local_8a0._0_4_ = auVar91._0_4_;
              if (fVar219 < auVar86._0_4_) {
                fVar222 = sqrtf(fVar219);
                auVar91 = ZEXT416((uint)local_8a0._0_4_);
                auVar85 = local_880._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar222 = auVar85._0_4_;
                auVar85 = local_880._0_16_;
              }
              fVar219 = fVar221 * 1.5 + fVar219 * -0.5 * fVar221 * fVar221 * fVar221;
              auVar225._0_4_ = auVar85._0_4_ * fVar219;
              auVar225._4_4_ = auVar85._4_4_ * fVar219;
              auVar225._8_4_ = auVar85._8_4_ * fVar219;
              auVar225._12_4_ = auVar85._12_4_ * fVar219;
              auVar86 = vdpps_avx(auVar3,auVar225,0x7f);
              fVar198 = auVar91._0_4_;
              fVar221 = auVar86._0_4_;
              auVar151._0_4_ = fVar221 * fVar221;
              auVar151._4_4_ = auVar86._4_4_ * auVar86._4_4_;
              auVar151._8_4_ = auVar86._8_4_ * auVar86._8_4_;
              auVar151._12_4_ = auVar86._12_4_ * auVar86._12_4_;
              auVar87 = vsubps_avx512vl(auVar84,auVar151);
              fVar223 = auVar87._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar223;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar89 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              if (fVar223 < 0.0) {
                local_6f0 = fVar219;
                fStack_6ec = fVar219;
                fStack_6e8 = fVar219;
                fStack_6e4 = fVar219;
                local_6e0 = auVar225;
                local_6d0 = auVar88;
                fVar223 = sqrtf(fVar223);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar91 = ZEXT416((uint)local_8a0._0_4_);
                auVar225 = local_6e0;
                auVar87 = local_6d0;
                auVar85 = local_880._0_16_;
                fVar219 = local_6f0;
                fVar241 = fStack_6ec;
                fVar242 = fStack_6e8;
                fVar243 = fStack_6e4;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar223 = auVar87._0_4_;
                auVar87 = auVar88;
                fVar241 = fVar219;
                fVar242 = fVar219;
                fVar243 = fVar219;
              }
              auVar258 = ZEXT1664(auVar3);
              auVar169._0_4_ = (float)local_6a0._0_4_ * (float)local_7e0._0_4_;
              auVar169._4_4_ = (float)local_6a0._0_4_ * (float)local_7e0._4_4_;
              auVar169._8_4_ = (float)local_6a0._0_4_ * fStack_7d8;
              auVar169._12_4_ = (float)local_6a0._0_4_ * fStack_7d4;
              auVar185._4_4_ = local_680._0_4_;
              auVar185._0_4_ = local_680._0_4_;
              auVar185._8_4_ = local_680._0_4_;
              auVar185._12_4_ = local_680._0_4_;
              auVar238 = vfmadd132ps_fma(auVar185,auVar169,local_7a0._0_16_);
              auVar170._4_4_ = local_660._0_4_;
              auVar170._0_4_ = local_660._0_4_;
              auVar170._8_4_ = local_660._0_4_;
              auVar170._12_4_ = local_660._0_4_;
              auVar238 = vfmadd132ps_fma(auVar170,auVar238,local_7c0._0_16_);
              auVar2 = vfmadd213ss_fma(auVar2,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar165 = auVar2._0_4_;
              auVar186._4_4_ = uVar165;
              auVar186._0_4_ = uVar165;
              auVar186._8_4_ = uVar165;
              auVar186._12_4_ = uVar165;
              auVar2 = vfmadd132ps_fma(auVar186,auVar238,local_780._0_16_);
              auVar171._0_4_ = auVar2._0_4_ * (float)local_820._0_4_;
              auVar171._4_4_ = auVar2._4_4_ * (float)local_820._0_4_;
              auVar171._8_4_ = auVar2._8_4_ * (float)local_820._0_4_;
              auVar171._12_4_ = auVar2._12_4_ * (float)local_820._0_4_;
              auVar2 = vdpps_avx(auVar85,auVar2,0x7f);
              fVar182 = auVar2._0_4_;
              auVar187._0_4_ = auVar85._0_4_ * fVar182;
              auVar187._4_4_ = auVar85._4_4_ * fVar182;
              auVar187._8_4_ = auVar85._8_4_ * fVar182;
              auVar187._12_4_ = auVar85._12_4_ * fVar182;
              auVar2 = vsubps_avx(auVar171,auVar187);
              fVar182 = (float)local_6c0._0_4_ * (float)local_840._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar199),
                                    ZEXT416((uint)(local_760._0_4_ * fVar149 * 1.9073486e-06)));
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar85,auVar24);
              auVar188._0_4_ = fVar219 * auVar2._0_4_ * fVar182;
              auVar188._4_4_ = fVar241 * auVar2._4_4_ * fVar182;
              auVar188._8_4_ = fVar242 * auVar2._8_4_ * fVar182;
              auVar188._12_4_ = fVar243 * auVar2._12_4_ * fVar182;
              auVar2 = vdpps_avx(auVar90,auVar225,0x7f);
              auVar239 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar199),auVar238);
              auVar91 = vdpps_avx(auVar3,auVar188,0x7f);
              auVar239 = vfmadd213ss_fma(ZEXT416((uint)(fVar198 + 1.0)),
                                         ZEXT416((uint)(fVar199 / fVar222)),auVar239);
              fVar219 = auVar2._0_4_ + auVar91._0_4_;
              auVar259 = ZEXT464((uint)fVar219);
              auVar2 = vdpps_avx(local_7f0,auVar225,0x7f);
              auVar91 = vdpps_avx(auVar3,auVar90,0x7f);
              auVar89 = vmulss_avx512f(auVar89,auVar87);
              fVar222 = auVar88._0_4_ * 1.5 + auVar89._0_4_ * auVar87._0_4_ * auVar87._0_4_;
              auVar87 = vdpps_avx(auVar3,local_7f0,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar91,auVar86,ZEXT416((uint)fVar219));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar86,auVar2);
              auVar91 = vpermilps_avx(local_640._0_16_,0xff);
              fVar223 = fVar223 - auVar91._0_4_;
              auVar88 = vshufps_avx(auVar85,auVar85,0xff);
              auVar91 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar222),auVar88);
              auVar250._8_4_ = 0x80000000;
              auVar250._0_8_ = 0x8000000080000000;
              auVar250._12_4_ = 0x80000000;
              auVar253 = ZEXT1664(auVar250);
              auVar245._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar245._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar245._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar248 = ZEXT1664(auVar245);
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar222));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar219),auVar87);
              auVar91 = vinsertps_avx(auVar245,auVar87,0x1c);
              auVar233._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar2._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar2._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar219),auVar233,0x10);
              auVar204._0_4_ = auVar89._0_4_;
              auVar204._4_4_ = auVar204._0_4_;
              auVar204._8_4_ = auVar204._0_4_;
              auVar204._12_4_ = auVar204._0_4_;
              auVar2 = vdivps_avx(auVar91,auVar204);
              auVar91 = vdivps_avx(auVar87,auVar204);
              auVar205._0_4_ = fVar221 * auVar2._0_4_ + fVar223 * auVar91._0_4_;
              auVar205._4_4_ = fVar221 * auVar2._4_4_ + fVar223 * auVar91._4_4_;
              auVar205._8_4_ = fVar221 * auVar2._8_4_ + fVar223 * auVar91._8_4_;
              auVar205._12_4_ = fVar221 * auVar2._12_4_ + fVar223 * auVar91._12_4_;
              auVar2 = vsubps_avx(local_760._0_16_,auVar205);
              auVar237 = ZEXT1664(auVar2);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar86,auVar25);
            } while (auVar239._0_4_ <= auVar91._0_4_);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar239._0_4_ + auVar238._0_4_)),local_700,
                                      ZEXT416(0x36000000));
            auVar26._8_4_ = 0x7fffffff;
            auVar26._0_8_ = 0x7fffffff7fffffff;
            auVar26._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx512vl(ZEXT416((uint)fVar223),auVar26);
          } while (auVar91._0_4_ <= auVar86._0_4_);
          fVar149 = auVar2._0_4_ + (float)local_710._0_4_;
          if ((fVar1 <= fVar149) && (fVar199 = *(float *)(ray + k * 4 + 0x100), fVar149 <= fVar199))
          {
            auVar91 = vmovshdup_avx(auVar2);
            fVar221 = auVar91._0_4_;
            if ((0.0 <= fVar221) && (fVar221 <= 1.0)) {
              auVar59._12_4_ = 0;
              auVar59._0_12_ = ZEXT412(0);
              auVar139._4_12_ = ZEXT412(0);
              auVar139._0_4_ = fVar220;
              auVar91 = vrsqrt14ss_avx512f(auVar59 << 0x20,auVar139._0_16_);
              fVar220 = auVar91._0_4_;
              auVar84 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              pGVar7 = (context->scene->geometries).items[uVar4].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar220 = fVar220 * 1.5 + auVar84._0_4_ * fVar220 * fVar220 * fVar220;
                auVar206._0_4_ = auVar3._0_4_ * fVar220;
                auVar206._4_4_ = auVar3._4_4_ * fVar220;
                auVar206._8_4_ = auVar3._8_4_ * fVar220;
                auVar206._12_4_ = auVar3._12_4_ * fVar220;
                auVar86 = vfmadd213ps_fma(auVar88,auVar206,auVar85);
                auVar84 = vshufps_avx(auVar206,auVar206,0xc9);
                auVar91 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar207._0_4_ = auVar206._0_4_ * auVar91._0_4_;
                auVar207._4_4_ = auVar206._4_4_ * auVar91._4_4_;
                auVar207._8_4_ = auVar206._8_4_ * auVar91._8_4_;
                auVar207._12_4_ = auVar206._12_4_ * auVar91._12_4_;
                auVar91 = vfmsub231ps_fma(auVar207,auVar85,auVar84);
                auVar84 = vshufps_avx(auVar91,auVar91,0xc9);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                auVar152._0_4_ = auVar86._0_4_ * auVar91._0_4_;
                auVar152._4_4_ = auVar86._4_4_ * auVar91._4_4_;
                auVar152._8_4_ = auVar86._8_4_ * auVar91._8_4_;
                auVar152._12_4_ = auVar86._12_4_ * auVar91._12_4_;
                auVar84 = vfmsub231ps_fma(auVar152,auVar84,auVar85);
                uVar165 = auVar84._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x100) = fVar149;
                  uVar6 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                  uVar6 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar165;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar221;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = uVar5;
                  *(uint *)(ray + k * 4 + 0x240) = uVar4;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  pRVar9 = context->user;
                  auVar216._8_4_ = 1;
                  auVar216._0_8_ = 0x100000001;
                  auVar216._12_4_ = 1;
                  auVar216._16_4_ = 1;
                  auVar216._20_4_ = 1;
                  auVar216._24_4_ = 1;
                  auVar216._28_4_ = 1;
                  local_460 = vpermps_avx2(auVar216,ZEXT1632(auVar2));
                  auVar94 = vpermps_avx2(auVar216,ZEXT1632(auVar84));
                  auVar231._8_4_ = 2;
                  auVar231._0_8_ = 0x200000002;
                  auVar231._12_4_ = 2;
                  auVar231._16_4_ = 2;
                  auVar231._20_4_ = 2;
                  auVar231._24_4_ = 2;
                  auVar231._28_4_ = 2;
                  local_4a0 = vpermps_avx2(auVar231,ZEXT1632(auVar84));
                  local_4c0[0] = (RTCHitN)auVar94[0];
                  local_4c0[1] = (RTCHitN)auVar94[1];
                  local_4c0[2] = (RTCHitN)auVar94[2];
                  local_4c0[3] = (RTCHitN)auVar94[3];
                  local_4c0[4] = (RTCHitN)auVar94[4];
                  local_4c0[5] = (RTCHitN)auVar94[5];
                  local_4c0[6] = (RTCHitN)auVar94[6];
                  local_4c0[7] = (RTCHitN)auVar94[7];
                  local_4c0[8] = (RTCHitN)auVar94[8];
                  local_4c0[9] = (RTCHitN)auVar94[9];
                  local_4c0[10] = (RTCHitN)auVar94[10];
                  local_4c0[0xb] = (RTCHitN)auVar94[0xb];
                  local_4c0[0xc] = (RTCHitN)auVar94[0xc];
                  local_4c0[0xd] = (RTCHitN)auVar94[0xd];
                  local_4c0[0xe] = (RTCHitN)auVar94[0xe];
                  local_4c0[0xf] = (RTCHitN)auVar94[0xf];
                  local_4c0[0x10] = (RTCHitN)auVar94[0x10];
                  local_4c0[0x11] = (RTCHitN)auVar94[0x11];
                  local_4c0[0x12] = (RTCHitN)auVar94[0x12];
                  local_4c0[0x13] = (RTCHitN)auVar94[0x13];
                  local_4c0[0x14] = (RTCHitN)auVar94[0x14];
                  local_4c0[0x15] = (RTCHitN)auVar94[0x15];
                  local_4c0[0x16] = (RTCHitN)auVar94[0x16];
                  local_4c0[0x17] = (RTCHitN)auVar94[0x17];
                  local_4c0[0x18] = (RTCHitN)auVar94[0x18];
                  local_4c0[0x19] = (RTCHitN)auVar94[0x19];
                  local_4c0[0x1a] = (RTCHitN)auVar94[0x1a];
                  local_4c0[0x1b] = (RTCHitN)auVar94[0x1b];
                  local_4c0[0x1c] = (RTCHitN)auVar94[0x1c];
                  local_4c0[0x1d] = (RTCHitN)auVar94[0x1d];
                  local_4c0[0x1e] = (RTCHitN)auVar94[0x1e];
                  local_4c0[0x1f] = (RTCHitN)auVar94[0x1f];
                  local_480 = uVar165;
                  uStack_47c = uVar165;
                  uStack_478 = uVar165;
                  uStack_474 = uVar165;
                  uStack_470 = uVar165;
                  uStack_46c = uVar165;
                  uStack_468 = uVar165;
                  uStack_464 = uVar165;
                  local_440 = ZEXT432(0) << 0x20;
                  local_420 = local_520._0_8_;
                  uStack_418 = local_520._8_8_;
                  uStack_410 = local_520._16_8_;
                  uStack_408 = local_520._24_8_;
                  local_400 = local_500;
                  auVar94 = vpcmpeqd_avx2(local_500,local_500);
                  local_858[1] = auVar94;
                  *local_858 = auVar94;
                  local_3e0 = pRVar9->instID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  local_3c0 = pRVar9->instPrimID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  *(float *)(ray + k * 4 + 0x100) = fVar149;
                  local_740 = local_560;
                  local_8d0.valid = (int *)local_740;
                  local_8d0.geometryUserPtr = pGVar7->userPtr;
                  local_8d0.context = context->user;
                  local_8d0.hit = local_4c0;
                  local_8d0.N = 8;
                  local_8d0.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar248 = ZEXT1664(auVar245);
                    auVar253 = ZEXT1664(auVar250);
                    auVar258 = ZEXT1664(auVar3);
                    auVar259 = ZEXT1664(ZEXT416((uint)fVar219));
                    (*pGVar7->intersectionFilterN)(&local_8d0);
                  }
                  if (local_740 != (undefined1  [32])0x0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      auVar253 = ZEXT1664(auVar253._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      (*p_Var8)(&local_8d0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      uVar82 = vptestmd_avx512vl(local_740,local_740);
                      iVar62 = *(int *)(local_8d0.hit + 4);
                      iVar63 = *(int *)(local_8d0.hit + 8);
                      iVar64 = *(int *)(local_8d0.hit + 0xc);
                      iVar65 = *(int *)(local_8d0.hit + 0x10);
                      iVar66 = *(int *)(local_8d0.hit + 0x14);
                      iVar67 = *(int *)(local_8d0.hit + 0x18);
                      iVar68 = *(int *)(local_8d0.hit + 0x1c);
                      bVar75 = (byte)uVar82;
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x180) =
                           (uint)(bVar75 & 1) * *(int *)local_8d0.hit |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x180);
                      *(uint *)(local_8d0.ray + 0x184) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x184);
                      *(uint *)(local_8d0.ray + 0x188) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x188);
                      *(uint *)(local_8d0.ray + 0x18c) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x18c);
                      *(uint *)(local_8d0.ray + 400) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 400);
                      *(uint *)(local_8d0.ray + 0x194) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x194);
                      *(uint *)(local_8d0.ray + 0x198) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x198);
                      *(uint *)(local_8d0.ray + 0x19c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x19c);
                      iVar62 = *(int *)(local_8d0.hit + 0x24);
                      iVar63 = *(int *)(local_8d0.hit + 0x28);
                      iVar64 = *(int *)(local_8d0.hit + 0x2c);
                      iVar65 = *(int *)(local_8d0.hit + 0x30);
                      iVar66 = *(int *)(local_8d0.hit + 0x34);
                      iVar67 = *(int *)(local_8d0.hit + 0x38);
                      iVar68 = *(int *)(local_8d0.hit + 0x3c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1a0) =
                           (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x20) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                      *(uint *)(local_8d0.ray + 0x1a4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1a4);
                      *(uint *)(local_8d0.ray + 0x1a8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1a8);
                      *(uint *)(local_8d0.ray + 0x1ac) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1ac);
                      *(uint *)(local_8d0.ray + 0x1b0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1b0);
                      *(uint *)(local_8d0.ray + 0x1b4) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1b4);
                      *(uint *)(local_8d0.ray + 0x1b8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1b8);
                      *(uint *)(local_8d0.ray + 0x1bc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1bc);
                      iVar62 = *(int *)(local_8d0.hit + 0x44);
                      iVar63 = *(int *)(local_8d0.hit + 0x48);
                      iVar64 = *(int *)(local_8d0.hit + 0x4c);
                      iVar65 = *(int *)(local_8d0.hit + 0x50);
                      iVar66 = *(int *)(local_8d0.hit + 0x54);
                      iVar67 = *(int *)(local_8d0.hit + 0x58);
                      iVar68 = *(int *)(local_8d0.hit + 0x5c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1c0) =
                           (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x40) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                      *(uint *)(local_8d0.ray + 0x1c4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1c4);
                      *(uint *)(local_8d0.ray + 0x1c8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1c8);
                      *(uint *)(local_8d0.ray + 0x1cc) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1cc);
                      *(uint *)(local_8d0.ray + 0x1d0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1d0);
                      *(uint *)(local_8d0.ray + 0x1d4) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1d4);
                      *(uint *)(local_8d0.ray + 0x1d8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1d8);
                      *(uint *)(local_8d0.ray + 0x1dc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1dc);
                      iVar62 = *(int *)(local_8d0.hit + 100);
                      iVar63 = *(int *)(local_8d0.hit + 0x68);
                      iVar64 = *(int *)(local_8d0.hit + 0x6c);
                      iVar65 = *(int *)(local_8d0.hit + 0x70);
                      iVar66 = *(int *)(local_8d0.hit + 0x74);
                      iVar67 = *(int *)(local_8d0.hit + 0x78);
                      iVar68 = *(int *)(local_8d0.hit + 0x7c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1e0) =
                           (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x60) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                      *(uint *)(local_8d0.ray + 0x1e4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1e4);
                      *(uint *)(local_8d0.ray + 0x1e8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1e8);
                      *(uint *)(local_8d0.ray + 0x1ec) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1ec);
                      *(uint *)(local_8d0.ray + 0x1f0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1f0);
                      *(uint *)(local_8d0.ray + 500) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 500);
                      *(uint *)(local_8d0.ray + 0x1f8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1f8);
                      *(uint *)(local_8d0.ray + 0x1fc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1fc);
                      iVar62 = *(int *)(local_8d0.hit + 0x84);
                      iVar63 = *(int *)(local_8d0.hit + 0x88);
                      iVar64 = *(int *)(local_8d0.hit + 0x8c);
                      iVar65 = *(int *)(local_8d0.hit + 0x90);
                      iVar66 = *(int *)(local_8d0.hit + 0x94);
                      iVar67 = *(int *)(local_8d0.hit + 0x98);
                      iVar68 = *(int *)(local_8d0.hit + 0x9c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x200) =
                           (uint)(bVar75 & 1) * *(int *)(local_8d0.hit + 0x80) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_8d0.ray + 0x200);
                      *(uint *)(local_8d0.ray + 0x204) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x204);
                      *(uint *)(local_8d0.ray + 0x208) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x208);
                      *(uint *)(local_8d0.ray + 0x20c) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x20c);
                      *(uint *)(local_8d0.ray + 0x210) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x210);
                      *(uint *)(local_8d0.ray + 0x214) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x214);
                      *(uint *)(local_8d0.ray + 0x218) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x218);
                      *(uint *)(local_8d0.ray + 0x21c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x21c);
                      auVar94 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar94;
                      auVar94 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar94;
                      auVar94 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar94;
                      auVar94 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar94;
                      goto LAB_01a44424;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar199;
                }
              }
            }
          }
LAB_01a44424:
          uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar235._4_4_ = uVar165;
          auVar235._0_4_ = uVar165;
          auVar235._8_4_ = uVar165;
          auVar235._12_4_ = uVar165;
          auVar235._16_4_ = uVar165;
          auVar235._20_4_ = uVar165;
          auVar235._24_4_ = uVar165;
          auVar235._28_4_ = uVar165;
          auVar237 = ZEXT3264(auVar235);
          auVar69._4_4_ = fStack_59c;
          auVar69._0_4_ = local_5a0;
          auVar69._8_4_ = fStack_598;
          auVar69._12_4_ = fStack_594;
          auVar69._16_4_ = fStack_590;
          auVar69._20_4_ = fStack_58c;
          auVar69._24_4_ = fStack_588;
          auVar69._28_4_ = fStack_584;
          uVar19 = vcmpps_avx512vl(auVar235,auVar69,0xd);
        }
        auVar162._0_4_ = (float)local_5e0._0_4_ + (float)local_5c0._0_4_;
        auVar162._4_4_ = (float)local_5e0._4_4_ + (float)local_5c0._4_4_;
        auVar162._8_4_ = fStack_5d8 + fStack_5b8;
        auVar162._12_4_ = fStack_5d4 + fStack_5b4;
        auVar162._16_4_ = fStack_5d0 + fStack_5b0;
        auVar162._20_4_ = fStack_5cc + fStack_5ac;
        auVar162._24_4_ = fStack_5c8 + fStack_5a8;
        auVar162._28_4_ = fStack_5c4 + fStack_5a4;
        uVar165 = auVar237._0_4_;
        auVar180._4_4_ = uVar165;
        auVar180._0_4_ = uVar165;
        auVar180._8_4_ = uVar165;
        auVar180._12_4_ = uVar165;
        auVar180._16_4_ = uVar165;
        auVar180._20_4_ = uVar165;
        auVar180._24_4_ = uVar165;
        auVar180._28_4_ = uVar165;
        uVar19 = vcmpps_avx512vl(auVar162,auVar180,2);
        auVar163._8_4_ = 2;
        auVar163._0_8_ = 0x200000002;
        auVar163._12_4_ = 2;
        auVar163._16_4_ = 2;
        auVar163._20_4_ = 2;
        auVar163._24_4_ = 2;
        auVar163._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar163,auVar36);
        local_5c0._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
        bVar81 = (bool)(bVar73 >> 1 & 1);
        local_5c0._4_4_ = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * 2;
        bVar81 = (bool)(bVar73 >> 2 & 1);
        fStack_5b8 = (float)((uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)(bVar73 >> 3 & 1);
        fStack_5b4 = (float)((uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)(bVar73 >> 4 & 1);
        fStack_5b0 = (float)((uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)(bVar73 >> 5 & 1);
        fStack_5ac = (float)((uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * 2);
        bVar81 = (bool)(bVar73 >> 6 & 1);
        fStack_5a8 = (float)((uint)bVar81 * auVar94._24_4_ | (uint)!bVar81 * 2);
        fStack_5a4 = (float)((uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2);
        bVar72 = (byte)uVar20 & bVar72 & (byte)uVar19;
        uVar19 = vpcmpd_avx512vl(_local_5c0,local_540,2);
        local_600 = _local_3a0;
        local_5a0 = (float)local_5e0._0_4_ + (float)local_3a0._0_4_;
        fStack_59c = (float)local_5e0._4_4_ + (float)local_3a0._4_4_;
        fStack_598 = fStack_5d8 + fStack_398;
        fStack_594 = fStack_5d4 + fStack_394;
        fStack_590 = fStack_5d0 + fStack_390;
        fStack_58c = fStack_5cc + fStack_38c;
        fStack_588 = fStack_5c8 + fStack_388;
        fStack_584 = fStack_5c4 + fStack_384;
        for (bVar78 = (byte)uVar19 & bVar72; auVar266 = ZEXT3264(auVar265), bVar78 != 0;
            bVar78 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar78 & (byte)uVar19) {
          auVar164._8_4_ = 0x7f800000;
          auVar164._0_8_ = 0x7f8000007f800000;
          auVar164._12_4_ = 0x7f800000;
          auVar164._16_4_ = 0x7f800000;
          auVar164._20_4_ = 0x7f800000;
          auVar164._24_4_ = 0x7f800000;
          auVar164._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar164,local_600);
          auVar140._0_4_ =
               (uint)(bVar78 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 1 & 1);
          auVar140._4_4_ = (uint)bVar81 * auVar94._4_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 2 & 1);
          auVar140._8_4_ = (uint)bVar81 * auVar94._8_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 3 & 1);
          auVar140._12_4_ = (uint)bVar81 * auVar94._12_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 4 & 1);
          auVar140._16_4_ = (uint)bVar81 * auVar94._16_4_ | (uint)!bVar81 * 0x7f800000;
          bVar81 = (bool)(bVar78 >> 5 & 1);
          auVar140._20_4_ = (uint)bVar81 * auVar94._20_4_ | (uint)!bVar81 * 0x7f800000;
          auVar140._24_4_ =
               (uint)(bVar78 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
          auVar140._28_4_ = 0x7f800000;
          auVar94 = vshufps_avx(auVar140,auVar140,0xb1);
          auVar94 = vminps_avx(auVar140,auVar94);
          auVar95 = vshufpd_avx(auVar94,auVar94,5);
          auVar94 = vminps_avx(auVar94,auVar95);
          auVar95 = vpermpd_avx2(auVar94,0x4e);
          auVar94 = vminps_avx(auVar94,auVar95);
          uVar19 = vcmpps_avx512vl(auVar140,auVar94,0);
          bVar75 = (byte)uVar19 & bVar78;
          bVar73 = bVar78;
          if (bVar75 != 0) {
            bVar73 = bVar75;
          }
          iVar22 = 0;
          for (uVar83 = (uint)bVar73; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
            iVar22 = iVar22 + 1;
          }
          uVar83 = *(uint *)(local_1c0 + (uint)(iVar22 << 2));
          uVar142 = *(uint *)(local_380 + (uint)(iVar22 << 2));
          fVar149 = auVar17._0_4_;
          if ((float)local_800._0_4_ < 0.0) {
            auVar253 = ZEXT1664(auVar253._0_16_);
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar259 = ZEXT1664(auVar259._0_16_);
            fVar149 = sqrtf((float)local_800._0_4_);
          }
          auVar248 = ZEXT464(uVar142);
          auVar2 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar84 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar3 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar85 = vminps_avx(auVar2,auVar3);
          auVar2 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
          auVar3 = vmaxps_avx(auVar84,auVar2);
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar85,auVar208);
          auVar2 = vandps_avx(auVar3,auVar208);
          auVar84 = vmaxps_avx(auVar84,auVar2);
          auVar2 = vmovshdup_avx(auVar84);
          auVar2 = vmaxss_avx(auVar2,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar2);
          fVar199 = auVar84._0_4_ * 1.9073486e-06;
          local_700 = vshufps_avx(auVar3,auVar3,0xff);
          auVar84 = vinsertps_avx(ZEXT416(uVar142),ZEXT416(uVar83),0x10);
          auVar237 = ZEXT1664(auVar84);
          lVar80 = 5;
          do {
            do {
              bVar81 = lVar80 == 0;
              lVar80 = lVar80 + -1;
              if (bVar81) goto LAB_01a45176;
              uVar165 = auVar237._0_4_;
              auVar153._4_4_ = uVar165;
              auVar153._0_4_ = uVar165;
              auVar153._8_4_ = uVar165;
              auVar153._12_4_ = uVar165;
              auVar84 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_7f0);
              auVar2 = vmovshdup_avx(auVar237._0_16_);
              fVar241 = auVar2._0_4_;
              fVar198 = 1.0 - fVar241;
              fVar219 = fVar241 * fVar241;
              auVar87 = SUB6416(ZEXT464(0x40400000),0);
              auVar86 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar85 = vfmadd213ss_fma(auVar87,auVar2,auVar86);
              auVar3 = vfmadd213ss_fma(auVar85,ZEXT416((uint)fVar219),SUB6416(ZEXT464(0x40000000),0)
                                      );
              auVar91 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar198),auVar86);
              auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar198 * fVar198)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar220 = fVar198 * fVar198 * -fVar241 * 0.5;
              fVar221 = auVar3._0_4_ * 0.5;
              fVar222 = auVar91._0_4_ * 0.5;
              fVar223 = fVar241 * fVar241 * -fVar198 * 0.5;
              auVar209._0_4_ = fVar223 * (float)local_7e0._0_4_;
              auVar209._4_4_ = fVar223 * (float)local_7e0._4_4_;
              auVar209._8_4_ = fVar223 * fStack_7d8;
              auVar209._12_4_ = fVar223 * fStack_7d4;
              auVar226._4_4_ = fVar222;
              auVar226._0_4_ = fVar222;
              auVar226._8_4_ = fVar222;
              auVar226._12_4_ = fVar222;
              auVar3 = vfmadd132ps_fma(auVar226,auVar209,local_7a0._0_16_);
              auVar189._4_4_ = fVar221;
              auVar189._0_4_ = fVar221;
              auVar189._8_4_ = fVar221;
              auVar189._12_4_ = fVar221;
              auVar3 = vfmadd132ps_fma(auVar189,auVar3,local_7c0._0_16_);
              auVar210._4_4_ = fVar220;
              auVar210._0_4_ = fVar220;
              auVar210._8_4_ = fVar220;
              auVar210._12_4_ = fVar220;
              auVar3 = vfmadd132ps_fma(auVar210,auVar3,local_780._0_16_);
              auVar91 = vfmadd231ss_fma(auVar86,auVar2,ZEXT416(0x41100000));
              local_660._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar2,ZEXT416(0x40800000));
              local_680._0_16_ = auVar91;
              auVar91 = vfmadd213ss_fma(auVar87,auVar2,ZEXT416(0xbf800000));
              local_6a0._0_16_ = auVar91;
              local_640._0_16_ = auVar3;
              auVar3 = vsubps_avx(auVar84,auVar3);
              auVar84 = vdpps_avx(auVar3,auVar3,0x7f);
              fVar220 = auVar84._0_4_;
              local_760 = auVar237._0_32_;
              if (fVar220 < 0.0) {
                local_880._0_4_ = auVar85._0_4_;
                _local_8a0 = ZEXT416((uint)fVar198);
                local_820._0_4_ = fVar219;
                local_840._0_4_ = fVar198 * -2.0;
                auVar259._0_4_ = sqrtf(fVar220);
                auVar259._4_60_ = extraout_var_00;
                auVar85 = ZEXT416((uint)local_880._0_4_);
                auVar91 = auVar259._0_16_;
                auVar86 = _local_8a0;
              }
              else {
                auVar91 = vsqrtss_avx(auVar84,auVar84);
                local_840._0_4_ = fVar198 * -2.0;
                local_820._0_4_ = fVar219;
                auVar86 = ZEXT416((uint)fVar198);
              }
              fVar219 = auVar86._0_4_;
              auVar88 = vfnmadd231ss_fma(ZEXT416((uint)(fVar241 * (fVar219 + fVar219))),auVar86,
                                         auVar86);
              auVar85 = vfmadd213ss_fma(auVar85,ZEXT416((uint)(fVar241 + fVar241)),
                                        ZEXT416((uint)(fVar241 * fVar241 * 3.0)));
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar2,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * fVar219 * -3.0)),
                                        ZEXT416((uint)(fVar219 + fVar219)),auVar86);
              auVar86 = vfmadd213ss_fma(ZEXT416((uint)local_840._0_4_),auVar2,
                                        ZEXT416((uint)local_820._0_4_));
              fVar219 = auVar88._0_4_ * 0.5;
              fVar221 = auVar85._0_4_ * 0.5;
              fVar222 = auVar87._0_4_ * 0.5;
              fVar223 = auVar86._0_4_ * 0.5;
              auVar211._0_4_ = fVar223 * (float)local_7e0._0_4_;
              auVar211._4_4_ = fVar223 * (float)local_7e0._4_4_;
              auVar211._8_4_ = fVar223 * fStack_7d8;
              auVar211._12_4_ = fVar223 * fStack_7d4;
              auVar190._4_4_ = fVar222;
              auVar190._0_4_ = fVar222;
              auVar190._8_4_ = fVar222;
              auVar190._12_4_ = fVar222;
              auVar85 = vfmadd132ps_fma(auVar190,auVar211,local_7a0._0_16_);
              auVar172._4_4_ = fVar221;
              auVar172._0_4_ = fVar221;
              auVar172._8_4_ = fVar221;
              auVar172._12_4_ = fVar221;
              auVar85 = vfmadd132ps_fma(auVar172,auVar85,local_7c0._0_16_);
              auVar261._4_4_ = fVar219;
              auVar261._0_4_ = fVar219;
              auVar261._8_4_ = fVar219;
              auVar261._12_4_ = fVar219;
              local_880._0_16_ = vfmadd132ps_fma(auVar261,auVar85,local_780._0_16_);
              local_820._0_16_ = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
              auVar60._12_4_ = 0;
              auVar60._0_12_ = ZEXT812(0);
              fVar219 = local_820._0_4_;
              auVar85 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar219));
              fVar221 = auVar85._0_4_;
              local_840._0_16_ = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar219));
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_820._0_16_,auVar27);
              auVar85 = vfnmadd213ss_fma(local_840._0_16_,local_820._0_16_,
                                         SUB6416(ZEXT464(0x40000000),0));
              local_6c0._0_4_ = auVar85._0_4_;
              local_8a0._0_4_ = auVar91._0_4_;
              if (fVar219 < auVar86._0_4_) {
                fVar222 = sqrtf(fVar219);
                auVar91 = ZEXT416((uint)local_8a0._0_4_);
                auVar85 = local_880._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(local_820._0_16_,local_820._0_16_);
                fVar222 = auVar85._0_4_;
                auVar85 = local_880._0_16_;
              }
              fVar219 = fVar221 * 1.5 + fVar219 * -0.5 * fVar221 * fVar221 * fVar221;
              auVar227._0_4_ = auVar85._0_4_ * fVar219;
              auVar227._4_4_ = auVar85._4_4_ * fVar219;
              auVar227._8_4_ = auVar85._8_4_ * fVar219;
              auVar227._12_4_ = auVar85._12_4_ * fVar219;
              auVar86 = vdpps_avx(auVar3,auVar227,0x7f);
              fVar198 = auVar91._0_4_;
              fVar221 = auVar86._0_4_;
              auVar154._0_4_ = fVar221 * fVar221;
              auVar154._4_4_ = auVar86._4_4_ * auVar86._4_4_;
              auVar154._8_4_ = auVar86._8_4_ * auVar86._8_4_;
              auVar154._12_4_ = auVar86._12_4_ * auVar86._12_4_;
              auVar87 = vsubps_avx512vl(auVar84,auVar154);
              fVar223 = auVar87._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar223;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar89 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
              if (fVar223 < 0.0) {
                local_6f0 = fVar219;
                fStack_6ec = fVar219;
                fStack_6e8 = fVar219;
                fStack_6e4 = fVar219;
                local_6e0 = auVar227;
                local_6d0 = auVar88;
                fVar223 = sqrtf(fVar223);
                auVar89 = ZEXT416(auVar89._0_4_);
                auVar91 = ZEXT416((uint)local_8a0._0_4_);
                auVar227 = local_6e0;
                auVar87 = local_6d0;
                auVar85 = local_880._0_16_;
                fVar219 = local_6f0;
                fVar241 = fStack_6ec;
                fVar242 = fStack_6e8;
                fVar243 = fStack_6e4;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar223 = auVar87._0_4_;
                auVar87 = auVar88;
                fVar241 = fVar219;
                fVar242 = fVar219;
                fVar243 = fVar219;
              }
              auVar258 = ZEXT1664(auVar3);
              auVar174._0_4_ = (float)local_6a0._0_4_ * (float)local_7e0._0_4_;
              auVar174._4_4_ = (float)local_6a0._0_4_ * (float)local_7e0._4_4_;
              auVar174._8_4_ = (float)local_6a0._0_4_ * fStack_7d8;
              auVar174._12_4_ = (float)local_6a0._0_4_ * fStack_7d4;
              auVar191._4_4_ = local_680._0_4_;
              auVar191._0_4_ = local_680._0_4_;
              auVar191._8_4_ = local_680._0_4_;
              auVar191._12_4_ = local_680._0_4_;
              auVar238 = vfmadd132ps_fma(auVar191,auVar174,local_7a0._0_16_);
              auVar175._4_4_ = local_660._0_4_;
              auVar175._0_4_ = local_660._0_4_;
              auVar175._8_4_ = local_660._0_4_;
              auVar175._12_4_ = local_660._0_4_;
              auVar238 = vfmadd132ps_fma(auVar175,auVar238,local_7c0._0_16_);
              auVar2 = vfmadd213ss_fma(auVar2,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
              uVar165 = auVar2._0_4_;
              auVar192._4_4_ = uVar165;
              auVar192._0_4_ = uVar165;
              auVar192._8_4_ = uVar165;
              auVar192._12_4_ = uVar165;
              auVar2 = vfmadd132ps_fma(auVar192,auVar238,local_780._0_16_);
              auVar176._0_4_ = auVar2._0_4_ * (float)local_820._0_4_;
              auVar176._4_4_ = auVar2._4_4_ * (float)local_820._0_4_;
              auVar176._8_4_ = auVar2._8_4_ * (float)local_820._0_4_;
              auVar176._12_4_ = auVar2._12_4_ * (float)local_820._0_4_;
              auVar2 = vdpps_avx(auVar85,auVar2,0x7f);
              fVar182 = auVar2._0_4_;
              auVar193._0_4_ = auVar85._0_4_ * fVar182;
              auVar193._4_4_ = auVar85._4_4_ * fVar182;
              auVar193._8_4_ = auVar85._8_4_ * fVar182;
              auVar193._12_4_ = auVar85._12_4_ * fVar182;
              auVar2 = vsubps_avx(auVar176,auVar193);
              fVar182 = (float)local_6c0._0_4_ * (float)local_840._0_4_;
              auVar238 = vmaxss_avx(ZEXT416((uint)fVar199),
                                    ZEXT416((uint)(local_760._0_4_ * fVar149 * 1.9073486e-06)));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(auVar85,auVar28);
              auVar194._0_4_ = fVar219 * auVar2._0_4_ * fVar182;
              auVar194._4_4_ = fVar241 * auVar2._4_4_ * fVar182;
              auVar194._8_4_ = fVar242 * auVar2._8_4_ * fVar182;
              auVar194._12_4_ = fVar243 * auVar2._12_4_ * fVar182;
              auVar2 = vdpps_avx(auVar90,auVar227,0x7f);
              auVar239 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar199),auVar238);
              auVar91 = vdpps_avx(auVar3,auVar194,0x7f);
              auVar239 = vfmadd213ss_fma(ZEXT416((uint)(fVar198 + 1.0)),
                                         ZEXT416((uint)(fVar199 / fVar222)),auVar239);
              fVar219 = auVar2._0_4_ + auVar91._0_4_;
              auVar259 = ZEXT464((uint)fVar219);
              auVar2 = vdpps_avx(local_7f0,auVar227,0x7f);
              auVar91 = vdpps_avx(auVar3,auVar90,0x7f);
              auVar89 = vmulss_avx512f(auVar89,auVar87);
              fVar222 = auVar88._0_4_ * 1.5 + auVar89._0_4_ * auVar87._0_4_ * auVar87._0_4_;
              auVar87 = vdpps_avx(auVar3,local_7f0,0x7f);
              auVar89 = vfnmadd231ss_fma(auVar91,auVar86,ZEXT416((uint)fVar219));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar86,auVar2);
              auVar91 = vpermilps_avx(local_640._0_16_,0xff);
              fVar223 = fVar223 - auVar91._0_4_;
              auVar88 = vshufps_avx(auVar85,auVar85,0xff);
              auVar91 = vfmsub213ss_fma(auVar89,ZEXT416((uint)fVar222),auVar88);
              auVar251._8_4_ = 0x80000000;
              auVar251._0_8_ = 0x8000000080000000;
              auVar251._12_4_ = 0x80000000;
              auVar253 = ZEXT1664(auVar251);
              auVar246._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = auVar91._8_4_ ^ 0x80000000;
              auVar246._12_4_ = auVar91._12_4_ ^ 0x80000000;
              auVar248 = ZEXT1664(auVar246);
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * fVar222));
              auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar2._0_4_ * auVar91._0_4_)),
                                        ZEXT416((uint)fVar219),auVar87);
              auVar91 = vinsertps_avx(auVar246,auVar87,0x1c);
              auVar234._0_8_ = auVar2._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar2._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar2._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar219),auVar234,0x10);
              auVar212._0_4_ = auVar89._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar2 = vdivps_avx(auVar91,auVar212);
              auVar91 = vdivps_avx(auVar87,auVar212);
              auVar213._0_4_ = fVar221 * auVar2._0_4_ + fVar223 * auVar91._0_4_;
              auVar213._4_4_ = fVar221 * auVar2._4_4_ + fVar223 * auVar91._4_4_;
              auVar213._8_4_ = fVar221 * auVar2._8_4_ + fVar223 * auVar91._8_4_;
              auVar213._12_4_ = fVar221 * auVar2._12_4_ + fVar223 * auVar91._12_4_;
              auVar2 = vsubps_avx(local_760._0_16_,auVar213);
              auVar237 = ZEXT1664(auVar2);
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(auVar86,auVar29);
            } while (auVar239._0_4_ <= auVar91._0_4_);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar239._0_4_ + auVar238._0_4_)),local_700,
                                      ZEXT416(0x36000000));
            auVar30._8_4_ = 0x7fffffff;
            auVar30._0_8_ = 0x7fffffff7fffffff;
            auVar30._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx512vl(ZEXT416((uint)fVar223),auVar30);
          } while (auVar91._0_4_ <= auVar86._0_4_);
          fVar149 = auVar2._0_4_ + (float)local_710._0_4_;
          if ((fVar1 <= fVar149) && (fVar199 = *(float *)(ray + k * 4 + 0x100), fVar149 <= fVar199))
          {
            auVar91 = vmovshdup_avx(auVar2);
            fVar221 = auVar91._0_4_;
            if ((0.0 <= fVar221) && (fVar221 <= 1.0)) {
              auVar61._12_4_ = 0;
              auVar61._0_12_ = ZEXT412(0);
              auVar141._16_16_ = auVar139._16_16_;
              auVar141._4_12_ = ZEXT412(0);
              auVar141._0_4_ = fVar220;
              auVar91 = vrsqrt14ss_avx512f(auVar61 << 0x20,auVar141._0_16_);
              fVar220 = auVar91._0_4_;
              auVar84 = vmulss_avx512f(auVar84,ZEXT416(0xbf000000));
              pGVar7 = (context->scene->geometries).items[uVar4].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar220 = fVar220 * 1.5 + auVar84._0_4_ * fVar220 * fVar220 * fVar220;
                auVar214._0_4_ = auVar3._0_4_ * fVar220;
                auVar214._4_4_ = auVar3._4_4_ * fVar220;
                auVar214._8_4_ = auVar3._8_4_ * fVar220;
                auVar214._12_4_ = auVar3._12_4_ * fVar220;
                auVar86 = vfmadd213ps_fma(auVar88,auVar214,auVar85);
                auVar84 = vshufps_avx(auVar214,auVar214,0xc9);
                auVar91 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar215._0_4_ = auVar214._0_4_ * auVar91._0_4_;
                auVar215._4_4_ = auVar214._4_4_ * auVar91._4_4_;
                auVar215._8_4_ = auVar214._8_4_ * auVar91._8_4_;
                auVar215._12_4_ = auVar214._12_4_ * auVar91._12_4_;
                auVar91 = vfmsub231ps_fma(auVar215,auVar85,auVar84);
                auVar84 = vshufps_avx(auVar91,auVar91,0xc9);
                auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
                auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                auVar155._0_4_ = auVar86._0_4_ * auVar91._0_4_;
                auVar155._4_4_ = auVar86._4_4_ * auVar91._4_4_;
                auVar155._8_4_ = auVar86._8_4_ * auVar91._8_4_;
                auVar155._12_4_ = auVar86._12_4_ * auVar91._12_4_;
                auVar84 = vfmsub231ps_fma(auVar155,auVar84,auVar85);
                uVar165 = auVar84._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x100) = fVar149;
                  uVar6 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                  uVar6 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar165;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar221;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = uVar5;
                  *(uint *)(ray + k * 4 + 0x240) = uVar4;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  pRVar9 = context->user;
                  auVar217._8_4_ = 1;
                  auVar217._0_8_ = 0x100000001;
                  auVar217._12_4_ = 1;
                  auVar217._16_4_ = 1;
                  auVar217._20_4_ = 1;
                  auVar217._24_4_ = 1;
                  auVar217._28_4_ = 1;
                  local_460 = vpermps_avx2(auVar217,ZEXT1632(auVar2));
                  auVar94 = vpermps_avx2(auVar217,ZEXT1632(auVar84));
                  auVar232._8_4_ = 2;
                  auVar232._0_8_ = 0x200000002;
                  auVar232._12_4_ = 2;
                  auVar232._16_4_ = 2;
                  auVar232._20_4_ = 2;
                  auVar232._24_4_ = 2;
                  auVar232._28_4_ = 2;
                  local_4a0 = vpermps_avx2(auVar232,ZEXT1632(auVar84));
                  local_4c0[0] = (RTCHitN)auVar94[0];
                  local_4c0[1] = (RTCHitN)auVar94[1];
                  local_4c0[2] = (RTCHitN)auVar94[2];
                  local_4c0[3] = (RTCHitN)auVar94[3];
                  local_4c0[4] = (RTCHitN)auVar94[4];
                  local_4c0[5] = (RTCHitN)auVar94[5];
                  local_4c0[6] = (RTCHitN)auVar94[6];
                  local_4c0[7] = (RTCHitN)auVar94[7];
                  local_4c0[8] = (RTCHitN)auVar94[8];
                  local_4c0[9] = (RTCHitN)auVar94[9];
                  local_4c0[10] = (RTCHitN)auVar94[10];
                  local_4c0[0xb] = (RTCHitN)auVar94[0xb];
                  local_4c0[0xc] = (RTCHitN)auVar94[0xc];
                  local_4c0[0xd] = (RTCHitN)auVar94[0xd];
                  local_4c0[0xe] = (RTCHitN)auVar94[0xe];
                  local_4c0[0xf] = (RTCHitN)auVar94[0xf];
                  local_4c0[0x10] = (RTCHitN)auVar94[0x10];
                  local_4c0[0x11] = (RTCHitN)auVar94[0x11];
                  local_4c0[0x12] = (RTCHitN)auVar94[0x12];
                  local_4c0[0x13] = (RTCHitN)auVar94[0x13];
                  local_4c0[0x14] = (RTCHitN)auVar94[0x14];
                  local_4c0[0x15] = (RTCHitN)auVar94[0x15];
                  local_4c0[0x16] = (RTCHitN)auVar94[0x16];
                  local_4c0[0x17] = (RTCHitN)auVar94[0x17];
                  local_4c0[0x18] = (RTCHitN)auVar94[0x18];
                  local_4c0[0x19] = (RTCHitN)auVar94[0x19];
                  local_4c0[0x1a] = (RTCHitN)auVar94[0x1a];
                  local_4c0[0x1b] = (RTCHitN)auVar94[0x1b];
                  local_4c0[0x1c] = (RTCHitN)auVar94[0x1c];
                  local_4c0[0x1d] = (RTCHitN)auVar94[0x1d];
                  local_4c0[0x1e] = (RTCHitN)auVar94[0x1e];
                  local_4c0[0x1f] = (RTCHitN)auVar94[0x1f];
                  local_480 = uVar165;
                  uStack_47c = uVar165;
                  uStack_478 = uVar165;
                  uStack_474 = uVar165;
                  uStack_470 = uVar165;
                  uStack_46c = uVar165;
                  uStack_468 = uVar165;
                  uStack_464 = uVar165;
                  local_440 = ZEXT432(0) << 0x20;
                  local_420 = local_520._0_8_;
                  uStack_418 = local_520._8_8_;
                  uStack_410 = local_520._16_8_;
                  uStack_408 = local_520._24_8_;
                  local_400 = local_500;
                  auVar94 = vpcmpeqd_avx2(local_500,local_500);
                  local_858[1] = auVar94;
                  *local_858 = auVar94;
                  local_3e0 = pRVar9->instID[0];
                  uStack_3dc = local_3e0;
                  uStack_3d8 = local_3e0;
                  uStack_3d4 = local_3e0;
                  uStack_3d0 = local_3e0;
                  uStack_3cc = local_3e0;
                  uStack_3c8 = local_3e0;
                  uStack_3c4 = local_3e0;
                  local_3c0 = pRVar9->instPrimID[0];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  *(float *)(ray + k * 4 + 0x100) = fVar149;
                  local_740 = local_560;
                  local_8d0.valid = (int *)local_740;
                  local_8d0.geometryUserPtr = pGVar7->userPtr;
                  local_8d0.context = context->user;
                  local_8d0.hit = local_4c0;
                  local_8d0.N = 8;
                  local_8d0.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar248 = ZEXT1664(auVar246);
                    auVar253 = ZEXT1664(auVar251);
                    auVar258 = ZEXT1664(auVar3);
                    auVar259 = ZEXT1664(ZEXT416((uint)fVar219));
                    (*pGVar7->intersectionFilterN)(&local_8d0);
                  }
                  if (local_740 != (undefined1  [32])0x0) {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      auVar253 = ZEXT1664(auVar253._0_16_);
                      auVar258 = ZEXT1664(auVar258._0_16_);
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      (*p_Var8)(&local_8d0);
                    }
                    if (local_740 != (undefined1  [32])0x0) {
                      uVar82 = vptestmd_avx512vl(local_740,local_740);
                      iVar62 = *(int *)(local_8d0.hit + 4);
                      iVar63 = *(int *)(local_8d0.hit + 8);
                      iVar64 = *(int *)(local_8d0.hit + 0xc);
                      iVar65 = *(int *)(local_8d0.hit + 0x10);
                      iVar66 = *(int *)(local_8d0.hit + 0x14);
                      iVar67 = *(int *)(local_8d0.hit + 0x18);
                      iVar68 = *(int *)(local_8d0.hit + 0x1c);
                      bVar73 = (byte)uVar82;
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x180) =
                           (uint)(bVar73 & 1) * *(int *)local_8d0.hit |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_8d0.ray + 0x180);
                      *(uint *)(local_8d0.ray + 0x184) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x184);
                      *(uint *)(local_8d0.ray + 0x188) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x188);
                      *(uint *)(local_8d0.ray + 0x18c) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x18c);
                      *(uint *)(local_8d0.ray + 400) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 400);
                      *(uint *)(local_8d0.ray + 0x194) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x194);
                      *(uint *)(local_8d0.ray + 0x198) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x198);
                      *(uint *)(local_8d0.ray + 0x19c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x19c);
                      iVar62 = *(int *)(local_8d0.hit + 0x24);
                      iVar63 = *(int *)(local_8d0.hit + 0x28);
                      iVar64 = *(int *)(local_8d0.hit + 0x2c);
                      iVar65 = *(int *)(local_8d0.hit + 0x30);
                      iVar66 = *(int *)(local_8d0.hit + 0x34);
                      iVar67 = *(int *)(local_8d0.hit + 0x38);
                      iVar68 = *(int *)(local_8d0.hit + 0x3c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1a0) =
                           (uint)(bVar73 & 1) * *(int *)(local_8d0.hit + 0x20) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_8d0.ray + 0x1a0);
                      *(uint *)(local_8d0.ray + 0x1a4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1a4);
                      *(uint *)(local_8d0.ray + 0x1a8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1a8);
                      *(uint *)(local_8d0.ray + 0x1ac) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1ac);
                      *(uint *)(local_8d0.ray + 0x1b0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1b0);
                      *(uint *)(local_8d0.ray + 0x1b4) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1b4);
                      *(uint *)(local_8d0.ray + 0x1b8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1b8);
                      *(uint *)(local_8d0.ray + 0x1bc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1bc);
                      iVar62 = *(int *)(local_8d0.hit + 0x44);
                      iVar63 = *(int *)(local_8d0.hit + 0x48);
                      iVar64 = *(int *)(local_8d0.hit + 0x4c);
                      iVar65 = *(int *)(local_8d0.hit + 0x50);
                      iVar66 = *(int *)(local_8d0.hit + 0x54);
                      iVar67 = *(int *)(local_8d0.hit + 0x58);
                      iVar68 = *(int *)(local_8d0.hit + 0x5c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1c0) =
                           (uint)(bVar73 & 1) * *(int *)(local_8d0.hit + 0x40) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_8d0.ray + 0x1c0);
                      *(uint *)(local_8d0.ray + 0x1c4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1c4);
                      *(uint *)(local_8d0.ray + 0x1c8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1c8);
                      *(uint *)(local_8d0.ray + 0x1cc) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1cc);
                      *(uint *)(local_8d0.ray + 0x1d0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1d0);
                      *(uint *)(local_8d0.ray + 0x1d4) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x1d4);
                      *(uint *)(local_8d0.ray + 0x1d8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1d8);
                      *(uint *)(local_8d0.ray + 0x1dc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1dc);
                      iVar62 = *(int *)(local_8d0.hit + 100);
                      iVar63 = *(int *)(local_8d0.hit + 0x68);
                      iVar64 = *(int *)(local_8d0.hit + 0x6c);
                      iVar65 = *(int *)(local_8d0.hit + 0x70);
                      iVar66 = *(int *)(local_8d0.hit + 0x74);
                      iVar67 = *(int *)(local_8d0.hit + 0x78);
                      iVar68 = *(int *)(local_8d0.hit + 0x7c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x1e0) =
                           (uint)(bVar73 & 1) * *(int *)(local_8d0.hit + 0x60) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_8d0.ray + 0x1e0);
                      *(uint *)(local_8d0.ray + 0x1e4) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x1e4);
                      *(uint *)(local_8d0.ray + 0x1e8) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x1e8);
                      *(uint *)(local_8d0.ray + 0x1ec) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x1ec);
                      *(uint *)(local_8d0.ray + 0x1f0) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x1f0);
                      *(uint *)(local_8d0.ray + 500) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 500);
                      *(uint *)(local_8d0.ray + 0x1f8) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x1f8);
                      *(uint *)(local_8d0.ray + 0x1fc) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x1fc);
                      iVar62 = *(int *)(local_8d0.hit + 0x84);
                      iVar63 = *(int *)(local_8d0.hit + 0x88);
                      iVar64 = *(int *)(local_8d0.hit + 0x8c);
                      iVar65 = *(int *)(local_8d0.hit + 0x90);
                      iVar66 = *(int *)(local_8d0.hit + 0x94);
                      iVar67 = *(int *)(local_8d0.hit + 0x98);
                      iVar68 = *(int *)(local_8d0.hit + 0x9c);
                      bVar81 = (bool)((byte)(uVar82 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar82 >> 2) & 1);
                      bVar11 = (bool)((byte)(uVar82 >> 3) & 1);
                      bVar12 = (bool)((byte)(uVar82 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar82 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar82 >> 6) & 1);
                      bVar15 = SUB81(uVar82 >> 7,0);
                      *(uint *)(local_8d0.ray + 0x200) =
                           (uint)(bVar73 & 1) * *(int *)(local_8d0.hit + 0x80) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_8d0.ray + 0x200);
                      *(uint *)(local_8d0.ray + 0x204) =
                           (uint)bVar81 * iVar62 | (uint)!bVar81 * *(int *)(local_8d0.ray + 0x204);
                      *(uint *)(local_8d0.ray + 0x208) =
                           (uint)bVar10 * iVar63 | (uint)!bVar10 * *(int *)(local_8d0.ray + 0x208);
                      *(uint *)(local_8d0.ray + 0x20c) =
                           (uint)bVar11 * iVar64 | (uint)!bVar11 * *(int *)(local_8d0.ray + 0x20c);
                      *(uint *)(local_8d0.ray + 0x210) =
                           (uint)bVar12 * iVar65 | (uint)!bVar12 * *(int *)(local_8d0.ray + 0x210);
                      *(uint *)(local_8d0.ray + 0x214) =
                           (uint)bVar13 * iVar66 | (uint)!bVar13 * *(int *)(local_8d0.ray + 0x214);
                      *(uint *)(local_8d0.ray + 0x218) =
                           (uint)bVar14 * iVar67 | (uint)!bVar14 * *(int *)(local_8d0.ray + 0x218);
                      *(uint *)(local_8d0.ray + 0x21c) =
                           (uint)bVar15 * iVar68 | (uint)!bVar15 * *(int *)(local_8d0.ray + 0x21c);
                      auVar94 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x220) = auVar94;
                      auVar94 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x240) = auVar94;
                      auVar94 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x260) = auVar94;
                      auVar94 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8d0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8d0.ray + 0x280) = auVar94;
                      goto LAB_01a45176;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar199;
                }
              }
            }
          }
LAB_01a45176:
          uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar236._4_4_ = uVar165;
          auVar236._0_4_ = uVar165;
          auVar236._8_4_ = uVar165;
          auVar236._12_4_ = uVar165;
          auVar236._16_4_ = uVar165;
          auVar236._20_4_ = uVar165;
          auVar236._24_4_ = uVar165;
          auVar236._28_4_ = uVar165;
          auVar237 = ZEXT3264(auVar236);
          auVar70._4_4_ = fStack_59c;
          auVar70._0_4_ = local_5a0;
          auVar70._8_4_ = fStack_598;
          auVar70._12_4_ = fStack_594;
          auVar70._16_4_ = fStack_590;
          auVar70._20_4_ = fStack_58c;
          auVar70._24_4_ = fStack_588;
          auVar70._28_4_ = fStack_584;
          uVar19 = vcmpps_avx512vl(auVar236,auVar70,0xd);
        }
        uVar21 = vpcmpd_avx512vl(local_540,local_360,1);
        uVar20 = vpcmpd_avx512vl(local_540,_local_5c0,1);
        auVar181._0_4_ = (float)local_5e0._0_4_ + (float)local_200._0_4_;
        auVar181._4_4_ = (float)local_5e0._4_4_ + (float)local_200._4_4_;
        auVar181._8_4_ = fStack_5d8 + fStack_1f8;
        auVar181._12_4_ = fStack_5d4 + fStack_1f4;
        auVar181._16_4_ = fStack_5d0 + fStack_1f0;
        auVar181._20_4_ = fStack_5cc + fStack_1ec;
        auVar181._24_4_ = fStack_5c8 + fStack_1e8;
        auVar181._28_4_ = fStack_5c4 + fStack_1e4;
        uVar165 = auVar237._0_4_;
        auVar197._4_4_ = uVar165;
        auVar197._0_4_ = uVar165;
        auVar197._8_4_ = uVar165;
        auVar197._12_4_ = uVar165;
        auVar197._16_4_ = uVar165;
        auVar197._20_4_ = uVar165;
        auVar197._24_4_ = uVar165;
        auVar197._28_4_ = uVar165;
        uVar19 = vcmpps_avx512vl(auVar181,auVar197,2);
        bVar76 = bVar76 & (byte)uVar21 & (byte)uVar19;
        auVar218._0_4_ = (float)local_5e0._0_4_ + (float)local_3a0._0_4_;
        auVar218._4_4_ = (float)local_5e0._4_4_ + (float)local_3a0._4_4_;
        auVar218._8_4_ = fStack_5d8 + fStack_398;
        auVar218._12_4_ = fStack_5d4 + fStack_394;
        auVar218._16_4_ = fStack_5d0 + fStack_390;
        auVar218._20_4_ = fStack_5cc + fStack_38c;
        auVar218._24_4_ = fStack_5c8 + fStack_388;
        auVar218._28_4_ = fStack_5c4 + fStack_384;
        uVar19 = vcmpps_avx512vl(auVar218,auVar197,2);
        bVar72 = bVar72 & (byte)uVar20 & (byte)uVar19 | bVar76;
        if (bVar72 != 0) {
          abStack_180[uVar77 * 0x60] = bVar72;
          bVar81 = (bool)(bVar76 >> 1 & 1);
          bVar10 = (bool)(bVar76 >> 2 & 1);
          bVar11 = (bool)(bVar76 >> 3 & 1);
          bVar12 = (bool)(bVar76 >> 4 & 1);
          bVar13 = (bool)(bVar76 >> 5 & 1);
          auStack_160[uVar77 * 0x18] =
               (uint)(bVar76 & 1) * local_200._0_4_ | (uint)!(bool)(bVar76 & 1) * local_3a0._0_4_;
          auStack_160[uVar77 * 0x18 + 1] =
               (uint)bVar81 * local_200._4_4_ | (uint)!bVar81 * local_3a0._4_4_;
          auStack_160[uVar77 * 0x18 + 2] =
               (uint)bVar10 * (int)fStack_1f8 | (uint)!bVar10 * (int)fStack_398;
          auStack_160[uVar77 * 0x18 + 3] =
               (uint)bVar11 * (int)fStack_1f4 | (uint)!bVar11 * (int)fStack_394;
          auStack_160[uVar77 * 0x18 + 4] =
               (uint)bVar12 * (int)fStack_1f0 | (uint)!bVar12 * (int)fStack_390;
          auStack_160[uVar77 * 0x18 + 5] =
               (uint)bVar13 * (int)fStack_1ec | (uint)!bVar13 * (int)fStack_38c;
          auStack_160[uVar77 * 0x18 + 6] =
               (uint)(bVar76 >> 6) * (int)fStack_1e8 | (uint)!(bool)(bVar76 >> 6) * (int)fStack_388;
          (&fStack_144)[uVar77 * 0x18] = fStack_384;
          uVar82 = vmovlps_avx(local_570);
          (&uStack_140)[uVar77 * 0xc] = uVar82;
          aiStack_138[uVar77 * 0x18] = local_b24 + 1;
          uVar77 = (ulong)((int)uVar77 + 1);
        }
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar267 = ZEXT3264(auVar94);
        auVar237 = ZEXT3264(_DAT_01f7b040);
        prim = local_850;
      }
    }
    do {
      uVar83 = (uint)uVar77;
      uVar77 = (ulong)(uVar83 - 1);
      if (uVar83 == 0) {
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar38._4_4_ = uVar165;
        auVar38._0_4_ = uVar165;
        auVar38._8_4_ = uVar165;
        auVar38._12_4_ = uVar165;
        auVar38._16_4_ = uVar165;
        auVar38._20_4_ = uVar165;
        auVar38._24_4_ = uVar165;
        auVar38._28_4_ = uVar165;
        uVar19 = vcmpps_avx512vl(local_340,auVar38,2);
        local_848 = (ulong)((uint)local_848 & (uint)uVar19);
        goto LAB_01a429fd;
      }
      auVar94 = *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x18);
      auVar178._0_4_ = auVar94._0_4_ + (float)local_5e0._0_4_;
      auVar178._4_4_ = auVar94._4_4_ + (float)local_5e0._4_4_;
      auVar178._8_4_ = auVar94._8_4_ + fStack_5d8;
      auVar178._12_4_ = auVar94._12_4_ + fStack_5d4;
      auVar178._16_4_ = auVar94._16_4_ + fStack_5d0;
      auVar178._20_4_ = auVar94._20_4_ + fStack_5cc;
      auVar178._24_4_ = auVar94._24_4_ + fStack_5c8;
      auVar178._28_4_ = auVar94._28_4_ + fStack_5c4;
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar165;
      auVar37._0_4_ = uVar165;
      auVar37._8_4_ = uVar165;
      auVar37._12_4_ = uVar165;
      auVar37._16_4_ = uVar165;
      auVar37._20_4_ = uVar165;
      auVar37._24_4_ = uVar165;
      auVar37._28_4_ = uVar165;
      uVar19 = vcmpps_avx512vl(auVar178,auVar37,2);
      uVar142 = (uint)uVar19 & (uint)abStack_180[uVar77 * 0x60];
    } while (uVar142 == 0);
    uVar82 = (&uStack_140)[uVar77 * 0xc];
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar82;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar95 = vblendmps_avx512vl(auVar196,auVar94);
    bVar72 = (byte)uVar142;
    auVar137._0_4_ =
         (uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar94._0_4_;
    bVar81 = (bool)((byte)(uVar142 >> 1) & 1);
    auVar137._4_4_ = (uint)bVar81 * auVar95._4_4_ | (uint)!bVar81 * (int)auVar94._4_4_;
    bVar81 = (bool)((byte)(uVar142 >> 2) & 1);
    auVar137._8_4_ = (uint)bVar81 * auVar95._8_4_ | (uint)!bVar81 * (int)auVar94._8_4_;
    bVar81 = (bool)((byte)(uVar142 >> 3) & 1);
    auVar137._12_4_ = (uint)bVar81 * auVar95._12_4_ | (uint)!bVar81 * (int)auVar94._12_4_;
    bVar81 = (bool)((byte)(uVar142 >> 4) & 1);
    auVar137._16_4_ = (uint)bVar81 * auVar95._16_4_ | (uint)!bVar81 * (int)auVar94._16_4_;
    bVar81 = (bool)((byte)(uVar142 >> 5) & 1);
    auVar137._20_4_ = (uint)bVar81 * auVar95._20_4_ | (uint)!bVar81 * (int)auVar94._20_4_;
    bVar81 = (bool)((byte)(uVar142 >> 6) & 1);
    auVar137._24_4_ = (uint)bVar81 * auVar95._24_4_ | (uint)!bVar81 * (int)auVar94._24_4_;
    auVar137._28_4_ =
         (uVar142 >> 7) * auVar95._28_4_ | (uint)!SUB41(uVar142 >> 7,0) * (int)auVar94._28_4_;
    auVar94 = vshufps_avx(auVar137,auVar137,0xb1);
    auVar94 = vminps_avx(auVar137,auVar94);
    auVar95 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar95);
    auVar95 = vpermpd_avx2(auVar94,0x4e);
    auVar94 = vminps_avx(auVar94,auVar95);
    uVar19 = vcmpps_avx512vl(auVar137,auVar94,0);
    bVar78 = (byte)uVar19 & bVar72;
    if (bVar78 != 0) {
      uVar142 = (uint)bVar78;
    }
    uVar143 = 0;
    for (; (uVar142 & 1) == 0; uVar142 = uVar142 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    local_b24 = aiStack_138[uVar77 * 0x18];
    bVar72 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar72;
    abStack_180[uVar77 * 0x60] = bVar72;
    if (bVar72 == 0) {
      uVar83 = uVar83 - 1;
    }
    uVar165 = (undefined4)uVar82;
    auVar159._4_4_ = uVar165;
    auVar159._0_4_ = uVar165;
    auVar159._8_4_ = uVar165;
    auVar159._12_4_ = uVar165;
    auVar159._16_4_ = uVar165;
    auVar159._20_4_ = uVar165;
    auVar159._24_4_ = uVar165;
    auVar159._28_4_ = uVar165;
    auVar84 = vmovshdup_avx(auVar166);
    auVar84 = vsubps_avx(auVar84,auVar166);
    auVar179._0_4_ = auVar84._0_4_;
    auVar179._4_4_ = auVar179._0_4_;
    auVar179._8_4_ = auVar179._0_4_;
    auVar179._12_4_ = auVar179._0_4_;
    auVar179._16_4_ = auVar179._0_4_;
    auVar179._20_4_ = auVar179._0_4_;
    auVar179._24_4_ = auVar179._0_4_;
    auVar179._28_4_ = auVar179._0_4_;
    auVar84 = vfmadd132ps_fma(auVar179,auVar159,auVar237._0_32_);
    auVar94 = ZEXT1632(auVar84);
    local_4c0[0] = (RTCHitN)auVar94[0];
    local_4c0[1] = (RTCHitN)auVar94[1];
    local_4c0[2] = (RTCHitN)auVar94[2];
    local_4c0[3] = (RTCHitN)auVar94[3];
    local_4c0[4] = (RTCHitN)auVar94[4];
    local_4c0[5] = (RTCHitN)auVar94[5];
    local_4c0[6] = (RTCHitN)auVar94[6];
    local_4c0[7] = (RTCHitN)auVar94[7];
    local_4c0[8] = (RTCHitN)auVar94[8];
    local_4c0[9] = (RTCHitN)auVar94[9];
    local_4c0[10] = (RTCHitN)auVar94[10];
    local_4c0[0xb] = (RTCHitN)auVar94[0xb];
    local_4c0[0xc] = (RTCHitN)auVar94[0xc];
    local_4c0[0xd] = (RTCHitN)auVar94[0xd];
    local_4c0[0xe] = (RTCHitN)auVar94[0xe];
    local_4c0[0xf] = (RTCHitN)auVar94[0xf];
    local_4c0[0x10] = (RTCHitN)auVar94[0x10];
    local_4c0[0x11] = (RTCHitN)auVar94[0x11];
    local_4c0[0x12] = (RTCHitN)auVar94[0x12];
    local_4c0[0x13] = (RTCHitN)auVar94[0x13];
    local_4c0[0x14] = (RTCHitN)auVar94[0x14];
    local_4c0[0x15] = (RTCHitN)auVar94[0x15];
    local_4c0[0x16] = (RTCHitN)auVar94[0x16];
    local_4c0[0x17] = (RTCHitN)auVar94[0x17];
    local_4c0[0x18] = (RTCHitN)auVar94[0x18];
    local_4c0[0x19] = (RTCHitN)auVar94[0x19];
    local_4c0[0x1a] = (RTCHitN)auVar94[0x1a];
    local_4c0[0x1b] = (RTCHitN)auVar94[0x1b];
    local_4c0[0x1c] = (RTCHitN)auVar94[0x1c];
    local_4c0[0x1d] = (RTCHitN)auVar94[0x1d];
    local_4c0[0x1e] = (RTCHitN)auVar94[0x1e];
    local_4c0[0x1f] = (RTCHitN)auVar94[0x1f];
    local_570._8_8_ = 0;
    local_570._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar143 * 4);
    uVar77 = (ulong)uVar83;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }